

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  undefined8 unaff_RBP;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar66 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  float fVar114;
  undefined4 uVar115;
  vint4 bi_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 bi_1;
  undefined1 auVar120 [16];
  vfloat4 b0;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar158;
  float fVar159;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  __m128 a;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar187 [16];
  float fVar197;
  float fVar199;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar202;
  float fVar203;
  float fVar213;
  float fVar214;
  vfloat4 a0_1;
  undefined1 auVar204 [16];
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  vfloat4 a0;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  RayQueryContext *local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  float fVar137;
  float fVar141;
  
  uVar22 = (ulong)(byte)prim[1];
  fVar114 = *(float *)(prim + uVar22 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar36 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar22 * 0x19 + 6));
  auVar130._0_4_ = fVar114 * auVar36._0_4_;
  auVar130._4_4_ = fVar114 * auVar36._4_4_;
  auVar130._8_4_ = fVar114 * auVar36._8_4_;
  auVar130._12_4_ = fVar114 * auVar36._12_4_;
  auVar43._0_4_ = fVar114 * auVar37._0_4_;
  auVar43._4_4_ = fVar114 * auVar37._4_4_;
  auVar43._8_4_ = fVar114 * auVar37._8_4_;
  auVar43._12_4_ = fVar114 * auVar37._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xb + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xc + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x12 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x13 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x14 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar52._4_4_ = auVar43._0_4_;
  auVar52._0_4_ = auVar43._0_4_;
  auVar52._8_4_ = auVar43._0_4_;
  auVar52._12_4_ = auVar43._0_4_;
  auVar12 = vshufps_avx(auVar43,auVar43,0x55);
  auVar41 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar114 = auVar41._0_4_;
  auVar39._0_4_ = fVar114 * auVar33._0_4_;
  fVar202 = auVar41._4_4_;
  auVar39._4_4_ = fVar202 * auVar33._4_4_;
  fVar186 = auVar41._8_4_;
  auVar39._8_4_ = fVar186 * auVar33._8_4_;
  fVar197 = auVar41._12_4_;
  auVar39._12_4_ = fVar197 * auVar33._12_4_;
  auVar47._0_4_ = auVar34._0_4_ * fVar114;
  auVar47._4_4_ = auVar34._4_4_ * fVar202;
  auVar47._8_4_ = auVar34._8_4_ * fVar186;
  auVar47._12_4_ = auVar34._12_4_ * fVar197;
  auVar44._0_4_ = auVar35._0_4_ * fVar114;
  auVar44._4_4_ = auVar35._4_4_ * fVar202;
  auVar44._8_4_ = auVar35._8_4_ * fVar186;
  auVar44._12_4_ = auVar35._12_4_ * fVar197;
  auVar41 = vfmadd231ps_fma(auVar39,auVar12,auVar37);
  auVar40 = vfmadd231ps_fma(auVar47,auVar12,auVar11);
  auVar12 = vfmadd231ps_fma(auVar44,auVar45,auVar12);
  auVar42 = vfmadd231ps_fma(auVar41,auVar52,auVar36);
  auVar40 = vfmadd231ps_fma(auVar40,auVar52,auVar38);
  auVar43 = vfmadd231ps_fma(auVar12,auVar58,auVar52);
  auVar53._4_4_ = auVar130._0_4_;
  auVar53._0_4_ = auVar130._0_4_;
  auVar53._8_4_ = auVar130._0_4_;
  auVar53._12_4_ = auVar130._0_4_;
  auVar12 = vshufps_avx(auVar130,auVar130,0x55);
  auVar41 = vshufps_avx(auVar130,auVar130,0xaa);
  auVar33 = vmulps_avx512vl(auVar41,auVar33);
  auVar131._0_4_ = auVar41._0_4_ * auVar34._0_4_;
  auVar131._4_4_ = auVar41._4_4_ * auVar34._4_4_;
  auVar131._8_4_ = auVar41._8_4_ * auVar34._8_4_;
  auVar131._12_4_ = auVar41._12_4_ * auVar34._12_4_;
  auVar121._0_4_ = auVar41._0_4_ * auVar35._0_4_;
  auVar121._4_4_ = auVar41._4_4_ * auVar35._4_4_;
  auVar121._8_4_ = auVar41._8_4_ * auVar35._8_4_;
  auVar121._12_4_ = auVar41._12_4_ * auVar35._12_4_;
  auVar34 = vfmadd231ps_avx512vl(auVar33,auVar12,auVar37);
  auVar37 = vfmadd231ps_fma(auVar131,auVar12,auVar11);
  auVar33 = vfmadd231ps_fma(auVar121,auVar12,auVar45);
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar53,auVar36);
  auVar11 = vfmadd231ps_fma(auVar37,auVar53,auVar38);
  auVar45 = vfmadd231ps_fma(auVar33,auVar53,auVar58);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar234 = ZEXT1664(auVar36);
  auVar49._8_4_ = 0x219392ef;
  auVar49._0_8_ = 0x219392ef219392ef;
  auVar49._12_4_ = 0x219392ef;
  auVar37 = vandps_avx512vl(auVar42,auVar36);
  uVar27 = vcmpps_avx512vl(auVar37,auVar49,1);
  bVar26 = (bool)((byte)uVar27 & 1);
  auVar41._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._0_4_;
  bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._4_4_;
  bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._8_4_;
  bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar42._12_4_;
  auVar37 = vandps_avx512vl(auVar40,auVar36);
  uVar27 = vcmpps_avx512vl(auVar37,auVar49,1);
  bVar26 = (bool)((byte)uVar27 & 1);
  auVar42._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar40._0_4_;
  bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar40._4_4_;
  bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar40._8_4_;
  bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar40._12_4_;
  auVar36 = vandps_avx512vl(auVar43,auVar36);
  uVar27 = vcmpps_avx512vl(auVar36,auVar49,1);
  bVar26 = (bool)((byte)uVar27 & 1);
  auVar40._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar43._0_4_;
  bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar43._4_4_;
  bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar43._8_4_;
  bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar43._12_4_;
  auVar36 = vrcp14ps_avx512vl(auVar41);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar235 = ZEXT1664(auVar37);
  auVar33 = vfnmadd213ps_avx512vl(auVar41,auVar36,auVar37);
  auVar33 = vfmadd132ps_fma(auVar33,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar42);
  auVar38 = vfnmadd213ps_avx512vl(auVar42,auVar36,auVar37);
  auVar34 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar40);
  auVar37 = vfnmadd213ps_avx512vl(auVar40,auVar36,auVar37);
  auVar58 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx512vl(auVar36,auVar35);
  auVar50._0_4_ = auVar33._0_4_ * auVar36._0_4_;
  auVar50._4_4_ = auVar33._4_4_ * auVar36._4_4_;
  auVar50._8_4_ = auVar33._8_4_ * auVar36._8_4_;
  auVar50._12_4_ = auVar33._12_4_ * auVar36._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx512vl(auVar36,auVar35);
  auVar48._0_4_ = auVar33._0_4_ * auVar36._0_4_;
  auVar48._4_4_ = auVar33._4_4_ * auVar36._4_4_;
  auVar48._8_4_ = auVar33._8_4_ * auVar36._8_4_;
  auVar48._12_4_ = auVar33._12_4_ * auVar36._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar22 * 0xe + 6);
  auVar36 = vpmovsxwd_avx(auVar33);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar11);
  auVar51._0_4_ = auVar34._0_4_ * auVar36._0_4_;
  auVar51._4_4_ = auVar34._4_4_ * auVar36._4_4_;
  auVar51._8_4_ = auVar34._8_4_ * auVar36._8_4_;
  auVar51._12_4_ = auVar34._12_4_ * auVar36._12_4_;
  auVar33 = vpbroadcastd_avx512vl();
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar36 = vpmovsxwd_avx(auVar38);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vsubps_avx(auVar36,auVar11);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar22 * 0x15 + 6);
  auVar36 = vpmovsxwd_avx(auVar11);
  auVar59._0_4_ = auVar34._0_4_ * auVar37._0_4_;
  auVar59._4_4_ = auVar34._4_4_ * auVar37._4_4_;
  auVar59._8_4_ = auVar34._8_4_ * auVar37._8_4_;
  auVar59._12_4_ = auVar34._12_4_ * auVar37._12_4_;
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar45);
  auVar132._0_4_ = auVar58._0_4_ * auVar36._0_4_;
  auVar132._4_4_ = auVar58._4_4_ * auVar36._4_4_;
  auVar132._8_4_ = auVar58._8_4_ * auVar36._8_4_;
  auVar132._12_4_ = auVar58._12_4_ * auVar36._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar22 * 0x17 + 6);
  auVar36 = vpmovsxwd_avx(auVar34);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar45);
  auVar46._0_4_ = auVar58._0_4_ * auVar36._0_4_;
  auVar46._4_4_ = auVar58._4_4_ * auVar36._4_4_;
  auVar46._8_4_ = auVar58._8_4_ * auVar36._8_4_;
  auVar46._12_4_ = auVar58._12_4_ * auVar36._12_4_;
  auVar36 = vpminsd_avx(auVar50,auVar48);
  auVar37 = vpminsd_avx(auVar51,auVar59);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar37 = vpminsd_avx(auVar132,auVar46);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar58._4_4_ = uVar115;
  auVar58._0_4_ = uVar115;
  auVar58._8_4_ = uVar115;
  auVar58._12_4_ = uVar115;
  auVar37 = vmaxps_avx512vl(auVar37,auVar58);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar45._8_4_ = 0x3f7ffffa;
  auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar45._12_4_ = 0x3f7ffffa;
  auVar38 = vmulps_avx512vl(auVar36,auVar45);
  auVar36 = vpmaxsd_avx(auVar50,auVar48);
  auVar37 = vpmaxsd_avx(auVar51,auVar59);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar37 = vpmaxsd_avx(auVar132,auVar46);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar35._4_4_ = uVar115;
  auVar35._0_4_ = uVar115;
  auVar35._8_4_ = uVar115;
  auVar35._12_4_ = uVar115;
  auVar37 = vminps_avx512vl(auVar37,auVar35);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar12._8_4_ = 0x3f800003;
  auVar12._0_8_ = 0x3f8000033f800003;
  auVar12._12_4_ = 0x3f800003;
  auVar36 = vmulps_avx512vl(auVar36,auVar12);
  uVar13 = vcmpps_avx512vl(auVar38,auVar36,2);
  uVar14 = vpcmpgtd_avx512vl(auVar33,_DAT_01f4ad30);
  uVar27 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar13 & 0xf & (byte)uVar14));
  auVar36 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar229 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar37);
  auVar237 = ZEXT464(0x3f800000);
  auVar37 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar236 = ZEXT1664(auVar37);
LAB_017dd8cc:
  if (uVar27 == 0) {
LAB_017df3d7:
    return uVar27 != 0;
  }
  lVar23 = 0;
  for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar23 = lVar23 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar23 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar37 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar22);
  lVar23 = uVar22 + 1;
  auVar33 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar23);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar11 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar22);
  auVar34 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar23);
  auVar39 = vpbroadcastd_avx512vl();
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar22),
                       auVar37,auVar40);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar23),
                       auVar33,auVar40);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar22 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar11,auVar40);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar23),
                       auVar34,auVar40);
  auVar59 = ZEXT816(0) << 0x40;
  auVar76._0_4_ = auVar33._0_4_ * 0.0;
  auVar76._4_4_ = auVar33._4_4_ * 0.0;
  auVar76._8_4_ = auVar33._8_4_ * 0.0;
  auVar76._12_4_ = auVar33._12_4_ * 0.0;
  auVar35 = vfmadd231ps_fma(auVar76,auVar42,auVar59);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar35);
  auVar78._0_4_ = auVar45._0_4_ + auVar37._0_4_;
  auVar78._4_4_ = auVar45._4_4_ + auVar37._4_4_;
  auVar78._8_4_ = auVar45._8_4_ + auVar37._8_4_;
  auVar78._12_4_ = auVar45._12_4_ + auVar37._12_4_;
  auVar121 = auVar229._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar35,auVar41,auVar121);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar37,auVar121);
  auVar204._0_4_ = auVar34._0_4_ * 0.0;
  auVar204._4_4_ = auVar34._4_4_ * 0.0;
  auVar204._8_4_ = auVar34._8_4_ * 0.0;
  auVar204._12_4_ = auVar34._12_4_ * 0.0;
  auVar35 = vfmadd231ps_fma(auVar204,auVar44,auVar59);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar35);
  auVar216._0_4_ = auVar45._0_4_ + auVar11._0_4_;
  auVar216._4_4_ = auVar45._4_4_ + auVar11._4_4_;
  auVar216._8_4_ = auVar45._8_4_ + auVar11._8_4_;
  auVar216._12_4_ = auVar45._12_4_ + auVar11._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar35,auVar43,auVar121);
  auVar47 = vfnmadd231ps_avx512vl(auVar45,auVar11,auVar121);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar33);
  auVar45 = vfmadd231ps_fma(auVar45,auVar41,auVar59);
  auVar12 = vfmadd231ps_fma(auVar45,auVar37,auVar59);
  auVar33 = vmulps_avx512vl(auVar33,auVar121);
  auVar33 = vfnmadd231ps_avx512vl(auVar33,auVar121,auVar42);
  auVar33 = vfmadd231ps_fma(auVar33,auVar59,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar33,auVar59,auVar37);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar34);
  auVar37 = vfmadd231ps_fma(auVar37,auVar43,auVar59);
  auVar45 = vfmadd231ps_fma(auVar37,auVar11,auVar59);
  auVar37 = vmulps_avx512vl(auVar34,auVar121);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar121,auVar44);
  auVar37 = vfmadd231ps_fma(auVar37,auVar59,auVar43);
  auVar35 = vfnmadd231ps_fma(auVar37,auVar59,auVar11);
  auVar37 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar33 = vshufps_avx(auVar216,auVar216,0xc9);
  fVar153 = auVar46._0_4_;
  auVar70._0_4_ = fVar153 * auVar33._0_4_;
  fVar158 = auVar46._4_4_;
  auVar70._4_4_ = fVar158 * auVar33._4_4_;
  fVar159 = auVar46._8_4_;
  auVar70._8_4_ = fVar159 * auVar33._8_4_;
  fVar201 = auVar46._12_4_;
  auVar70._12_4_ = fVar201 * auVar33._12_4_;
  auVar33 = vfmsub231ps_fma(auVar70,auVar37,auVar216);
  auVar11 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar73._0_4_ = fVar153 * auVar33._0_4_;
  auVar73._4_4_ = fVar158 * auVar33._4_4_;
  auVar73._8_4_ = fVar159 * auVar33._8_4_;
  auVar73._12_4_ = fVar201 * auVar33._12_4_;
  auVar37 = vfmsub231ps_fma(auVar73,auVar37,auVar47);
  auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar33 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar114 = auVar41._0_4_;
  auVar178._0_4_ = auVar33._0_4_ * fVar114;
  fVar202 = auVar41._4_4_;
  auVar178._4_4_ = auVar33._4_4_ * fVar202;
  fVar186 = auVar41._8_4_;
  auVar178._8_4_ = auVar33._8_4_ * fVar186;
  fVar197 = auVar41._12_4_;
  auVar178._12_4_ = auVar33._12_4_ * fVar197;
  auVar33 = vfmsub231ps_fma(auVar178,auVar37,auVar45);
  auVar45 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar179._0_4_ = auVar33._0_4_ * fVar114;
  auVar179._4_4_ = auVar33._4_4_ * fVar202;
  auVar179._8_4_ = auVar33._8_4_ * fVar186;
  auVar179._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmsub231ps_fma(auVar179,auVar37,auVar35);
  auVar35 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar199 = auVar37._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar199;
  auVar33 = vrsqrt14ss_avx512f(auVar59,auVar180);
  auVar42 = vmulss_avx512f(auVar33,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar137 = auVar33._0_4_;
  fVar141 = auVar42._0_4_ - auVar43._0_4_ * fVar137 * fVar137 * fVar137;
  fVar203 = fVar141 * auVar11._0_4_;
  fVar213 = fVar141 * auVar11._4_4_;
  fVar214 = fVar141 * auVar11._8_4_;
  fVar215 = fVar141 * auVar11._12_4_;
  auVar33 = vdpps_avx(auVar11,auVar34,0x7f);
  auVar142._0_4_ = fVar199 * auVar34._0_4_;
  auVar142._4_4_ = fVar199 * auVar34._4_4_;
  auVar142._8_4_ = fVar199 * auVar34._8_4_;
  auVar142._12_4_ = fVar199 * auVar34._12_4_;
  fVar199 = auVar33._0_4_;
  auVar71._0_4_ = fVar199 * auVar11._0_4_;
  auVar71._4_4_ = fVar199 * auVar11._4_4_;
  auVar71._8_4_ = fVar199 * auVar11._8_4_;
  auVar71._12_4_ = fVar199 * auVar11._12_4_;
  auVar11 = vsubps_avx(auVar142,auVar71);
  auVar33 = vrcp14ss_avx512f(auVar59,auVar180);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar33,ZEXT416(0x40000000));
  fVar199 = auVar33._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar137 = auVar37._0_4_;
  auVar74._4_12_ = ZEXT812(0) << 0x20;
  auVar74._0_4_ = fVar137;
  auVar33 = vrsqrt14ss_avx512f(auVar59,auVar74);
  auVar34 = vmulss_avx512f(auVar33,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar177 = auVar33._0_4_;
  fVar177 = auVar34._0_4_ - auVar42._0_4_ * fVar177 * fVar177 * fVar177;
  fVar185 = fVar177 * auVar45._0_4_;
  fVar196 = fVar177 * auVar45._4_4_;
  fVar198 = fVar177 * auVar45._8_4_;
  fVar200 = fVar177 * auVar45._12_4_;
  auVar33 = vdpps_avx(auVar45,auVar35,0x7f);
  auVar62._0_4_ = fVar137 * auVar35._0_4_;
  auVar62._4_4_ = fVar137 * auVar35._4_4_;
  auVar62._8_4_ = fVar137 * auVar35._8_4_;
  auVar62._12_4_ = fVar137 * auVar35._12_4_;
  fVar137 = auVar33._0_4_;
  auVar54._0_4_ = fVar137 * auVar45._0_4_;
  auVar54._4_4_ = fVar137 * auVar45._4_4_;
  auVar54._8_4_ = fVar137 * auVar45._8_4_;
  auVar54._12_4_ = fVar137 * auVar45._12_4_;
  auVar34 = vsubps_avx(auVar62,auVar54);
  auVar33 = vrcp14ss_avx512f(auVar59,auVar74);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar33,ZEXT416(0x40000000));
  fVar137 = auVar33._0_4_ * auVar37._0_4_;
  auVar37 = vshufps_avx(auVar78,auVar78,0xff);
  auVar72._0_4_ = fVar203 * auVar37._0_4_;
  auVar72._4_4_ = fVar213 * auVar37._4_4_;
  auVar72._8_4_ = fVar214 * auVar37._8_4_;
  auVar72._12_4_ = fVar215 * auVar37._12_4_;
  auVar45 = vsubps_avx(auVar78,auVar72);
  auVar33 = vshufps_avx(auVar46,auVar46,0xff);
  auVar63._0_4_ = fVar203 * auVar33._0_4_ + auVar37._0_4_ * fVar141 * auVar11._0_4_ * fVar199;
  auVar63._4_4_ = fVar213 * auVar33._4_4_ + auVar37._4_4_ * fVar141 * auVar11._4_4_ * fVar199;
  auVar63._8_4_ = fVar214 * auVar33._8_4_ + auVar37._8_4_ * fVar141 * auVar11._8_4_ * fVar199;
  auVar63._12_4_ = fVar215 * auVar33._12_4_ + auVar37._12_4_ * fVar141 * auVar11._12_4_ * fVar199;
  auVar11 = vsubps_avx(auVar46,auVar63);
  auVar220._0_4_ = auVar78._0_4_ + auVar72._0_4_;
  auVar220._4_4_ = auVar78._4_4_ + auVar72._4_4_;
  auVar220._8_4_ = auVar78._8_4_ + auVar72._8_4_;
  auVar220._12_4_ = auVar78._12_4_ + auVar72._12_4_;
  auVar122._0_4_ = fVar153 + auVar63._0_4_;
  auVar122._4_4_ = fVar158 + auVar63._4_4_;
  auVar122._8_4_ = fVar159 + auVar63._8_4_;
  auVar122._12_4_ = fVar201 + auVar63._12_4_;
  auVar37 = vshufps_avx(auVar12,auVar12,0xff);
  auVar68._0_4_ = fVar185 * auVar37._0_4_;
  auVar68._4_4_ = fVar196 * auVar37._4_4_;
  auVar68._8_4_ = fVar198 * auVar37._8_4_;
  auVar68._12_4_ = fVar200 * auVar37._12_4_;
  auVar35 = vsubps_avx(auVar12,auVar68);
  auVar33 = vshufps_avx(auVar41,auVar41,0xff);
  auVar55._0_4_ = fVar185 * auVar33._0_4_ + auVar37._0_4_ * fVar177 * auVar34._0_4_ * fVar137;
  auVar55._4_4_ = fVar196 * auVar33._4_4_ + auVar37._4_4_ * fVar177 * auVar34._4_4_ * fVar137;
  auVar55._8_4_ = fVar198 * auVar33._8_4_ + auVar37._8_4_ * fVar177 * auVar34._8_4_ * fVar137;
  auVar55._12_4_ = fVar200 * auVar33._12_4_ + auVar37._12_4_ * fVar177 * auVar34._12_4_ * fVar137;
  auVar37 = vsubps_avx(auVar41,auVar55);
  auVar48 = vaddps_avx512vl(auVar12,auVar68);
  auVar56._0_4_ = fVar114 + auVar55._0_4_;
  auVar56._4_4_ = fVar202 + auVar55._4_4_;
  auVar56._8_4_ = fVar186 + auVar55._8_4_;
  auVar56._12_4_ = fVar197 + auVar55._12_4_;
  auVar33 = vmulps_avx512vl(auVar11,auVar40);
  auVar49 = vaddps_avx512vl(auVar45,auVar33);
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  auVar50 = vsubps_avx512vl(auVar35,auVar37);
  auVar37 = vmulps_avx512vl(auVar122,auVar40);
  auVar51 = vaddps_avx512vl(auVar220,auVar37);
  auVar37 = vmulps_avx512vl(auVar56,auVar40);
  auVar52 = vsubps_avx512vl(auVar48,auVar37);
  auVar12 = vsubps_avx(auVar45,auVar58);
  uVar115 = auVar12._0_4_;
  auVar60._4_4_ = uVar115;
  auVar60._0_4_ = uVar115;
  auVar60._8_4_ = uVar115;
  auVar60._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar12,auVar12,0x55);
  auVar33 = vshufps_avx(auVar12,auVar12,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar114 = pre->ray_space[k].vz.field_0.m128[0];
  fVar202 = pre->ray_space[k].vz.field_0.m128[1];
  fVar186 = pre->ray_space[k].vz.field_0.m128[2];
  fVar197 = pre->ray_space[k].vz.field_0.m128[3];
  auVar57._0_4_ = fVar114 * auVar33._0_4_;
  auVar57._4_4_ = fVar202 * auVar33._4_4_;
  auVar57._8_4_ = fVar186 * auVar33._8_4_;
  auVar57._12_4_ = fVar197 * auVar33._12_4_;
  auVar37 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar4,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar60);
  auVar53 = vsubps_avx512vl(auVar49,auVar58);
  uVar115 = auVar53._0_4_;
  auVar123._4_4_ = uVar115;
  auVar123._0_4_ = uVar115;
  auVar123._8_4_ = uVar115;
  auVar123._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar53,auVar53,0x55);
  auVar33 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar61._0_4_ = fVar114 * auVar33._0_4_;
  auVar61._4_4_ = fVar202 * auVar33._4_4_;
  auVar61._8_4_ = fVar186 * auVar33._8_4_;
  auVar61._12_4_ = fVar197 * auVar33._12_4_;
  auVar37 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar4,auVar37);
  auVar46 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar123);
  auVar54 = vsubps_avx512vl(auVar50,auVar58);
  uVar115 = auVar54._0_4_;
  auVar66._4_4_ = uVar115;
  auVar66._0_4_ = uVar115;
  auVar66._8_4_ = uVar115;
  auVar66._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar54,auVar54,0x55);
  auVar33 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar79._0_4_ = auVar33._0_4_ * fVar114;
  auVar79._4_4_ = auVar33._4_4_ * fVar202;
  auVar79._8_4_ = auVar33._8_4_ * fVar186;
  auVar79._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar37);
  auVar47 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar66);
  auVar41 = vsubps_avx(auVar35,auVar58);
  uVar115 = auVar41._0_4_;
  auVar64._4_4_ = uVar115;
  auVar64._0_4_ = uVar115;
  auVar64._8_4_ = uVar115;
  auVar64._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar41,auVar41,0x55);
  auVar33 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar167._0_4_ = auVar33._0_4_ * fVar114;
  auVar167._4_4_ = auVar33._4_4_ * fVar202;
  auVar167._8_4_ = auVar33._8_4_ * fVar186;
  auVar167._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar4,auVar37);
  auVar59 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar64);
  auVar40 = vsubps_avx(auVar220,auVar58);
  uVar115 = auVar40._0_4_;
  auVar65._4_4_ = uVar115;
  auVar65._0_4_ = uVar115;
  auVar65._8_4_ = uVar115;
  auVar65._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar40,auVar40,0x55);
  auVar33 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar181._0_4_ = auVar33._0_4_ * fVar114;
  auVar181._4_4_ = auVar33._4_4_ * fVar202;
  auVar181._8_4_ = auVar33._8_4_ * fVar186;
  auVar181._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar4,auVar37);
  auVar121 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar65);
  auVar55 = vsubps_avx512vl(auVar51,auVar58);
  uVar115 = auVar55._0_4_;
  auVar67._4_4_ = uVar115;
  auVar67._0_4_ = uVar115;
  auVar67._8_4_ = uVar115;
  auVar67._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar55,auVar55,0x55);
  auVar33 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar187._0_4_ = auVar33._0_4_ * fVar114;
  auVar187._4_4_ = auVar33._4_4_ * fVar202;
  auVar187._8_4_ = auVar33._8_4_ * fVar186;
  auVar187._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar37);
  auVar130 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar67);
  auVar56 = vsubps_avx512vl(auVar52,auVar58);
  uVar115 = auVar56._0_4_;
  auVar77._4_4_ = uVar115;
  auVar77._0_4_ = uVar115;
  auVar77._8_4_ = uVar115;
  auVar77._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar56,auVar56,0x55);
  auVar33 = vshufps_avx(auVar56,auVar56,0xaa);
  auVar205._0_4_ = auVar33._0_4_ * fVar114;
  auVar205._4_4_ = auVar33._4_4_ * fVar202;
  auVar205._8_4_ = auVar33._8_4_ * fVar186;
  auVar205._12_4_ = auVar33._12_4_ * fVar197;
  auVar37 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar4,auVar37);
  auVar131 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar77);
  auVar57 = vsubps_avx512vl(auVar48,auVar58);
  uVar115 = auVar57._0_4_;
  auVar80._4_4_ = uVar115;
  auVar80._0_4_ = uVar115;
  auVar80._8_4_ = uVar115;
  auVar80._12_4_ = uVar115;
  auVar37 = vshufps_avx(auVar57,auVar57,0x55);
  auVar33 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar69._0_4_ = fVar114 * auVar33._0_4_;
  auVar69._4_4_ = fVar202 * auVar33._4_4_;
  auVar69._8_4_ = fVar186 * auVar33._8_4_;
  auVar69._12_4_ = fVar197 * auVar33._12_4_;
  auVar37 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar4,auVar37);
  auVar132 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar80);
  auVar11 = vmovlhps_avx(auVar44,auVar121);
  auVar34 = vmovlhps_avx(auVar46,auVar130);
  auVar42 = vmovlhps_avx512f(auVar47,auVar131);
  auVar43 = vmovlhps_avx512f(auVar59,auVar132);
  auVar33 = vminps_avx(auVar11,auVar34);
  auVar37 = vmaxps_avx(auVar11,auVar34);
  auVar58 = vminps_avx512vl(auVar42,auVar43);
  auVar33 = vminps_avx(auVar33,auVar58);
  auVar58 = vmaxps_avx512vl(auVar42,auVar43);
  auVar37 = vmaxps_avx(auVar37,auVar58);
  auVar58 = vshufpd_avx(auVar33,auVar33,3);
  auVar33 = vminps_avx(auVar33,auVar58);
  auVar58 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vmaxps_avx(auVar37,auVar58);
  auVar33 = vandps_avx512vl(auVar33,auVar234._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar234._0_16_);
  auVar37 = vmaxps_avx(auVar33,auVar37);
  auVar33 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar33,auVar37);
  fVar114 = auVar37._0_4_ * 9.536743e-07;
  auVar44 = vmovddup_avx512vl(auVar44);
  auVar46 = vmovddup_avx512vl(auVar46);
  auVar160._0_8_ = auVar47._0_8_;
  auVar160._8_8_ = auVar160._0_8_;
  auVar168._0_8_ = auVar59._0_8_;
  auVar168._8_8_ = auVar168._0_8_;
  auVar81 = vbroadcastss_avx512vl(ZEXT416((uint)fVar114));
  auVar37 = vxorps_avx512vl(auVar81._0_16_,auVar230._0_16_);
  local_78 = auVar37._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  bVar26 = false;
  uVar22 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x30);
  auVar37 = vsubps_avx(auVar34,auVar11);
  auVar47 = vsubps_avx512vl(auVar42,auVar34);
  auVar59 = vsubps_avx512vl(auVar43,auVar42);
  auVar33 = vsubps_avx(auVar220,auVar45);
  auVar60 = vsubps_avx512vl(auVar51,auVar49);
  auVar61 = vsubps_avx512vl(auVar52,auVar50);
  auVar62 = vsubps_avx512vl(auVar48,auVar35);
  auVar63 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar75 = auVar58;
LAB_017ddfc7:
  auVar122 = vshufps_avx(auVar75,auVar75,0x50);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._0_16_ = auVar221;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar123 = vsubps_avx(auVar221,auVar122);
  fVar202 = auVar122._0_4_;
  fVar137 = auVar121._0_4_;
  auVar138._0_4_ = fVar137 * fVar202;
  fVar186 = auVar122._4_4_;
  fVar141 = auVar121._4_4_;
  auVar138._4_4_ = fVar141 * fVar186;
  fVar197 = auVar122._8_4_;
  auVar138._8_4_ = fVar137 * fVar197;
  fVar199 = auVar122._12_4_;
  auVar138._12_4_ = fVar141 * fVar199;
  fVar177 = auVar130._0_4_;
  auVar143._0_4_ = fVar177 * fVar202;
  fVar153 = auVar130._4_4_;
  auVar143._4_4_ = fVar153 * fVar186;
  auVar143._8_4_ = fVar177 * fVar197;
  auVar143._12_4_ = fVar153 * fVar199;
  fVar158 = auVar131._0_4_;
  auVar148._0_4_ = fVar158 * fVar202;
  fVar159 = auVar131._4_4_;
  auVar148._4_4_ = fVar159 * fVar186;
  auVar148._8_4_ = fVar158 * fVar197;
  auVar148._12_4_ = fVar159 * fVar199;
  fVar198 = auVar132._0_4_;
  auVar124._0_4_ = fVar198 * fVar202;
  fVar200 = auVar132._4_4_;
  auVar124._4_4_ = fVar200 * fVar186;
  auVar124._8_4_ = fVar198 * fVar197;
  auVar124._12_4_ = fVar200 * fVar199;
  auVar64 = vfmadd231ps_avx512vl(auVar138,auVar123,auVar44);
  auVar65 = vfmadd231ps_avx512vl(auVar143,auVar123,auVar46);
  auVar66 = vfmadd231ps_fma(auVar148,auVar123,auVar160);
  auVar123 = vfmadd231ps_fma(auVar124,auVar168,auVar123);
  auVar122 = vmovshdup_avx(auVar58);
  fVar186 = auVar58._0_4_;
  fVar202 = (auVar122._0_4_ - fVar186) * 0.04761905;
  auVar96._4_4_ = fVar186;
  auVar96._0_4_ = fVar186;
  auVar96._8_4_ = fVar186;
  auVar96._12_4_ = fVar186;
  auVar96._16_4_ = fVar186;
  auVar96._20_4_ = fVar186;
  auVar96._24_4_ = fVar186;
  auVar96._28_4_ = fVar186;
  auVar86._0_8_ = auVar122._0_8_;
  auVar86._8_8_ = auVar86._0_8_;
  auVar86._16_8_ = auVar86._0_8_;
  auVar86._24_8_ = auVar86._0_8_;
  auVar99 = vsubps_avx(auVar86,auVar96);
  uVar115 = auVar64._0_4_;
  auVar100._4_4_ = uVar115;
  auVar100._0_4_ = uVar115;
  auVar100._8_4_ = uVar115;
  auVar100._12_4_ = uVar115;
  auVar100._16_4_ = uVar115;
  auVar100._20_4_ = uVar115;
  auVar100._24_4_ = uVar115;
  auVar100._28_4_ = uVar115;
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  auVar98 = ZEXT1632(auVar64);
  auVar97 = vpermps_avx2(auVar88,auVar98);
  auVar82 = vbroadcastss_avx512vl(auVar65);
  auVar92 = ZEXT1632(auVar65);
  auVar83 = vpermps_avx512vl(auVar88,auVar92);
  auVar84 = vbroadcastss_avx512vl(auVar66);
  auVar93 = ZEXT1632(auVar66);
  auVar85 = vpermps_avx512vl(auVar88,auVar93);
  auVar86 = vbroadcastss_avx512vl(auVar123);
  auVar95 = ZEXT1632(auVar123);
  auVar87 = vpermps_avx512vl(auVar88,auVar95);
  auVar101._4_4_ = fVar202;
  auVar101._0_4_ = fVar202;
  auVar101._8_4_ = fVar202;
  auVar101._12_4_ = fVar202;
  auVar101._16_4_ = fVar202;
  auVar101._20_4_ = fVar202;
  auVar101._24_4_ = fVar202;
  auVar101._28_4_ = fVar202;
  auVar94._8_4_ = 2;
  auVar94._0_8_ = 0x200000002;
  auVar94._12_4_ = 2;
  auVar94._16_4_ = 2;
  auVar94._20_4_ = 2;
  auVar94._24_4_ = 2;
  auVar94._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar94,auVar98);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar90 = vpermps_avx512vl(auVar89,auVar98);
  auVar91 = vpermps_avx512vl(auVar94,auVar92);
  auVar92 = vpermps_avx512vl(auVar89,auVar92);
  auVar98 = vpermps_avx2(auVar94,auVar93);
  auVar93 = vpermps_avx512vl(auVar89,auVar93);
  auVar94 = vpermps_avx512vl(auVar94,auVar95);
  auVar89 = vpermps_avx512vl(auVar89,auVar95);
  auVar122 = vfmadd132ps_fma(auVar99,auVar96,_DAT_01f7b040);
  auVar99 = vsubps_avx(auVar102,ZEXT1632(auVar122));
  auVar95 = vmulps_avx512vl(auVar82,ZEXT1632(auVar122));
  auVar102 = ZEXT1632(auVar122);
  auVar96 = vmulps_avx512vl(auVar83,auVar102);
  auVar123 = vfmadd231ps_fma(auVar95,auVar99,auVar100);
  auVar66 = vfmadd231ps_fma(auVar96,auVar99,auVar97);
  auVar95 = vmulps_avx512vl(auVar84,auVar102);
  auVar96 = vmulps_avx512vl(auVar85,auVar102);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar82);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar83);
  auVar82 = vmulps_avx512vl(auVar86,auVar102);
  auVar100 = ZEXT1632(auVar122);
  auVar83 = vmulps_avx512vl(auVar87,auVar100);
  auVar84 = vfmadd231ps_avx512vl(auVar82,auVar99,auVar84);
  auVar85 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar85);
  fVar197 = auVar122._0_4_;
  fVar199 = auVar122._4_4_;
  auVar82._4_4_ = fVar199 * auVar95._4_4_;
  auVar82._0_4_ = fVar197 * auVar95._0_4_;
  fVar201 = auVar122._8_4_;
  auVar82._8_4_ = fVar201 * auVar95._8_4_;
  fVar185 = auVar122._12_4_;
  auVar82._12_4_ = fVar185 * auVar95._12_4_;
  auVar82._16_4_ = auVar95._16_4_ * 0.0;
  auVar82._20_4_ = auVar95._20_4_ * 0.0;
  auVar82._24_4_ = auVar95._24_4_ * 0.0;
  auVar82._28_4_ = fVar186;
  auVar83._4_4_ = fVar199 * auVar96._4_4_;
  auVar83._0_4_ = fVar197 * auVar96._0_4_;
  auVar83._8_4_ = fVar201 * auVar96._8_4_;
  auVar83._12_4_ = fVar185 * auVar96._12_4_;
  auVar83._16_4_ = auVar96._16_4_ * 0.0;
  auVar83._20_4_ = auVar96._20_4_ * 0.0;
  auVar83._24_4_ = auVar96._24_4_ * 0.0;
  auVar83._28_4_ = auVar97._28_4_;
  auVar123 = vfmadd231ps_fma(auVar82,auVar99,ZEXT1632(auVar123));
  auVar66 = vfmadd231ps_fma(auVar83,auVar99,ZEXT1632(auVar66));
  auVar87._0_4_ = fVar197 * auVar84._0_4_;
  auVar87._4_4_ = fVar199 * auVar84._4_4_;
  auVar87._8_4_ = fVar201 * auVar84._8_4_;
  auVar87._12_4_ = fVar185 * auVar84._12_4_;
  auVar87._16_4_ = auVar84._16_4_ * 0.0;
  auVar87._20_4_ = auVar84._20_4_ * 0.0;
  auVar87._24_4_ = auVar84._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar97._4_4_ = fVar199 * auVar85._4_4_;
  auVar97._0_4_ = fVar197 * auVar85._0_4_;
  auVar97._8_4_ = fVar201 * auVar85._8_4_;
  auVar97._12_4_ = fVar185 * auVar85._12_4_;
  auVar97._16_4_ = auVar85._16_4_ * 0.0;
  auVar97._20_4_ = auVar85._20_4_ * 0.0;
  auVar97._24_4_ = auVar85._24_4_ * 0.0;
  auVar97._28_4_ = auVar84._28_4_;
  auVar64 = vfmadd231ps_fma(auVar87,auVar99,auVar95);
  auVar65 = vfmadd231ps_fma(auVar97,auVar99,auVar96);
  auVar84._28_4_ = auVar96._28_4_;
  auVar84._0_28_ =
       ZEXT1628(CONCAT412(fVar185 * auVar65._12_4_,
                          CONCAT48(fVar201 * auVar65._8_4_,
                                   CONCAT44(fVar199 * auVar65._4_4_,fVar197 * auVar65._0_4_))));
  auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar185 * auVar64._12_4_,
                                               CONCAT48(fVar201 * auVar64._8_4_,
                                                        CONCAT44(fVar199 * auVar64._4_4_,
                                                                 fVar197 * auVar64._0_4_)))),auVar99
                            ,ZEXT1632(auVar123));
  auVar77 = vfmadd231ps_fma(auVar84,auVar99,ZEXT1632(auVar66));
  auVar97 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar123));
  auVar82 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar66));
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar97 = vmulps_avx512vl(auVar97,auVar83);
  auVar82 = vmulps_avx512vl(auVar82,auVar83);
  auVar95._0_4_ = fVar202 * auVar97._0_4_;
  auVar95._4_4_ = fVar202 * auVar97._4_4_;
  auVar95._8_4_ = fVar202 * auVar97._8_4_;
  auVar95._12_4_ = fVar202 * auVar97._12_4_;
  auVar95._16_4_ = fVar202 * auVar97._16_4_;
  auVar95._20_4_ = fVar202 * auVar97._20_4_;
  auVar95._24_4_ = fVar202 * auVar97._24_4_;
  auVar95._28_4_ = 0;
  auVar97 = vmulps_avx512vl(auVar101,auVar82);
  auVar66 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
  auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01fb9fc0,ZEXT1632(auVar66));
  auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar77),_DAT_01fb9fc0,ZEXT1632(auVar66));
  auVar129._0_4_ = auVar95._0_4_ + auVar67._0_4_;
  auVar129._4_4_ = auVar95._4_4_ + auVar67._4_4_;
  auVar129._8_4_ = auVar95._8_4_ + auVar67._8_4_;
  auVar129._12_4_ = auVar95._12_4_ + auVar67._12_4_;
  auVar129._16_4_ = auVar95._16_4_ + 0.0;
  auVar129._20_4_ = auVar95._20_4_ + 0.0;
  auVar129._24_4_ = auVar95._24_4_ + 0.0;
  auVar129._28_4_ = 0;
  auVar96 = ZEXT1632(auVar66);
  auVar85 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar96);
  auVar86 = vaddps_avx512vl(ZEXT1632(auVar77),auVar97);
  auVar87 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar96);
  auVar97 = vsubps_avx(auVar82,auVar85);
  auVar87 = vsubps_avx512vl(auVar84,auVar87);
  auVar85 = vmulps_avx512vl(auVar91,auVar100);
  auVar95 = vmulps_avx512vl(auVar92,auVar100);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar88);
  auVar88 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar90);
  auVar90 = vmulps_avx512vl(auVar98,auVar100);
  auVar95 = vmulps_avx512vl(auVar93,auVar100);
  auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar91);
  auVar91 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar92);
  auVar92 = vmulps_avx512vl(auVar94,auVar100);
  auVar89 = vmulps_avx512vl(auVar89,auVar100);
  auVar123 = vfmadd231ps_fma(auVar92,auVar99,auVar98);
  auVar98 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar93);
  auVar89 = vmulps_avx512vl(auVar100,auVar90);
  auVar94 = ZEXT1632(auVar122);
  auVar92 = vmulps_avx512vl(auVar94,auVar91);
  auVar85 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar85);
  auVar88 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar88);
  auVar98 = vmulps_avx512vl(auVar94,auVar98);
  auVar89 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar185 * auVar123._12_4_,
                                          CONCAT48(fVar201 * auVar123._8_4_,
                                                   CONCAT44(fVar199 * auVar123._4_4_,
                                                            fVar197 * auVar123._0_4_)))),auVar99,
                       auVar90);
  auVar90 = vfmadd231ps_avx512vl(auVar98,auVar99,auVar91);
  auVar98._4_4_ = fVar199 * auVar89._4_4_;
  auVar98._0_4_ = fVar197 * auVar89._0_4_;
  auVar98._8_4_ = fVar201 * auVar89._8_4_;
  auVar98._12_4_ = fVar185 * auVar89._12_4_;
  auVar98._16_4_ = auVar89._16_4_ * 0.0;
  auVar98._20_4_ = auVar89._20_4_ * 0.0;
  auVar98._24_4_ = auVar89._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar91 = vmulps_avx512vl(auVar94,auVar90);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar99,auVar85);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar99);
  auVar99 = vsubps_avx512vl(auVar89,auVar85);
  auVar85 = vsubps_avx512vl(auVar90,auVar88);
  auVar88 = vmulps_avx512vl(auVar99,auVar83);
  auVar83 = vmulps_avx512vl(auVar85,auVar83);
  fVar186 = fVar202 * auVar88._0_4_;
  fVar197 = fVar202 * auVar88._4_4_;
  auVar99._4_4_ = fVar197;
  auVar99._0_4_ = fVar186;
  fVar199 = fVar202 * auVar88._8_4_;
  auVar99._8_4_ = fVar199;
  fVar201 = fVar202 * auVar88._12_4_;
  auVar99._12_4_ = fVar201;
  fVar185 = fVar202 * auVar88._16_4_;
  auVar99._16_4_ = fVar185;
  fVar196 = fVar202 * auVar88._20_4_;
  auVar99._20_4_ = fVar196;
  fVar202 = fVar202 * auVar88._24_4_;
  auVar99._24_4_ = fVar202;
  auVar99._28_4_ = auVar88._28_4_;
  auVar83 = vmulps_avx512vl(auVar101,auVar83);
  auVar89 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar96);
  auVar90 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,auVar96);
  auVar184._0_4_ = auVar98._0_4_ + fVar186;
  auVar184._4_4_ = auVar98._4_4_ + fVar197;
  auVar184._8_4_ = auVar98._8_4_ + fVar199;
  auVar184._12_4_ = auVar98._12_4_ + fVar201;
  auVar184._16_4_ = auVar98._16_4_ + fVar185;
  auVar184._20_4_ = auVar98._20_4_ + fVar196;
  auVar184._24_4_ = auVar98._24_4_ + fVar202;
  auVar184._28_4_ = auVar98._28_4_ + auVar88._28_4_;
  auVar99 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar66));
  auVar88 = vaddps_avx512vl(auVar91,auVar83);
  auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,ZEXT1632(auVar66));
  auVar99 = vsubps_avx(auVar89,auVar99);
  auVar83 = vsubps_avx512vl(auVar90,auVar83);
  auVar103 = ZEXT1632(auVar67);
  auVar85 = vsubps_avx512vl(auVar98,auVar103);
  auVar105 = ZEXT1632(auVar77);
  auVar92 = vsubps_avx512vl(auVar91,auVar105);
  auVar93 = vsubps_avx512vl(auVar89,auVar82);
  auVar85 = vaddps_avx512vl(auVar85,auVar93);
  auVar93 = vsubps_avx512vl(auVar90,auVar84);
  auVar92 = vaddps_avx512vl(auVar92,auVar93);
  auVar93 = vmulps_avx512vl(auVar105,auVar85);
  auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar103,auVar92);
  auVar94 = vmulps_avx512vl(auVar86,auVar85);
  auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar129,auVar92);
  auVar95 = vmulps_avx512vl(auVar87,auVar85);
  auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar97,auVar92);
  auVar96 = vmulps_avx512vl(auVar84,auVar85);
  auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar82,auVar92);
  auVar100 = vmulps_avx512vl(auVar91,auVar85);
  auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar98,auVar92);
  auVar101 = vmulps_avx512vl(auVar88,auVar85);
  auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar184,auVar92);
  auVar102 = vmulps_avx512vl(auVar83,auVar85);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar99,auVar92);
  auVar85 = vmulps_avx512vl(auVar90,auVar85);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar89,auVar92);
  auVar92 = vminps_avx512vl(auVar93,auVar94);
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar94 = vminps_avx512vl(auVar95,auVar96);
  auVar92 = vminps_avx512vl(auVar92,auVar94);
  auVar94 = vmaxps_avx512vl(auVar95,auVar96);
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar94 = vminps_avx512vl(auVar100,auVar101);
  auVar95 = vmaxps_avx512vl(auVar100,auVar101);
  auVar96 = vminps_avx512vl(auVar102,auVar85);
  auVar94 = vminps_avx512vl(auVar94,auVar96);
  auVar92 = vminps_avx512vl(auVar92,auVar94);
  auVar85 = vmaxps_avx512vl(auVar102,auVar85);
  auVar85 = vmaxps_avx512vl(auVar95,auVar85);
  auVar93 = vmaxps_avx512vl(auVar93,auVar85);
  uVar13 = vcmpps_avx512vl(auVar92,auVar81,2);
  auVar85._4_4_ = uStack_74;
  auVar85._0_4_ = local_78;
  auVar85._8_4_ = uStack_70;
  auVar85._12_4_ = uStack_6c;
  auVar85._16_4_ = uStack_68;
  auVar85._20_4_ = uStack_64;
  auVar85._24_4_ = uStack_60;
  auVar85._28_4_ = uStack_5c;
  uVar14 = vcmpps_avx512vl(auVar93,auVar85,5);
  bVar20 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar20 != 0) {
    auVar92 = vsubps_avx512vl(auVar82,auVar103);
    auVar93 = vsubps_avx512vl(auVar84,auVar105);
    auVar94 = vsubps_avx512vl(auVar89,auVar98);
    auVar92 = vaddps_avx512vl(auVar92,auVar94);
    auVar94 = vsubps_avx512vl(auVar90,auVar91);
    auVar93 = vaddps_avx512vl(auVar93,auVar94);
    auVar94 = vmulps_avx512vl(auVar105,auVar92);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar103);
    auVar86 = vmulps_avx512vl(auVar86,auVar92);
    auVar86 = vfnmadd213ps_avx512vl(auVar129,auVar93,auVar86);
    auVar87 = vmulps_avx512vl(auVar87,auVar92);
    auVar87 = vfnmadd213ps_avx512vl(auVar97,auVar93,auVar87);
    auVar97 = vmulps_avx512vl(auVar84,auVar92);
    auVar84 = vfnmadd231ps_avx512vl(auVar97,auVar93,auVar82);
    auVar97 = vmulps_avx512vl(auVar91,auVar92);
    auVar91 = vfnmadd231ps_avx512vl(auVar97,auVar93,auVar98);
    auVar97 = vmulps_avx512vl(auVar88,auVar92);
    auVar88 = vfnmadd213ps_avx512vl(auVar184,auVar93,auVar97);
    auVar97 = vmulps_avx512vl(auVar83,auVar92);
    auVar95 = vfnmadd213ps_avx512vl(auVar99,auVar93,auVar97);
    auVar99 = vmulps_avx512vl(auVar90,auVar92);
    auVar89 = vfnmadd231ps_avx512vl(auVar99,auVar89,auVar93);
    auVar97 = vminps_avx(auVar94,auVar86);
    auVar99 = vmaxps_avx(auVar94,auVar86);
    auVar82 = vminps_avx(auVar87,auVar84);
    auVar82 = vminps_avx(auVar97,auVar82);
    auVar97 = vmaxps_avx(auVar87,auVar84);
    auVar99 = vmaxps_avx(auVar99,auVar97);
    auVar98 = vminps_avx(auVar91,auVar88);
    auVar97 = vmaxps_avx(auVar91,auVar88);
    auVar83 = vminps_avx(auVar95,auVar89);
    auVar98 = vminps_avx(auVar98,auVar83);
    auVar98 = vminps_avx(auVar82,auVar98);
    auVar82 = vmaxps_avx(auVar95,auVar89);
    auVar97 = vmaxps_avx(auVar97,auVar82);
    auVar99 = vmaxps_avx(auVar99,auVar97);
    uVar13 = vcmpps_avx512vl(auVar99,auVar85,5);
    uVar14 = vcmpps_avx512vl(auVar98,auVar81,2);
    bVar20 = bVar20 & (byte)uVar13 & (byte)uVar14;
    if (bVar20 != 0) {
      mask_stack[uVar22] = (uint)bVar20;
      BVar2 = (BBox1f)vmovlps_avx(auVar58);
      cu_stack[uVar22] = BVar2;
      BVar2 = (BBox1f)vmovlps_avx(auVar75);
      cv_stack[uVar22] = BVar2;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
  }
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar229 = ZEXT1664(auVar58);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar230 = ZEXT1664(auVar58);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT3264(auVar99);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar232 = ZEXT1664(auVar58);
  auVar233 = ZEXT3264(_DAT_01fb9fe0);
LAB_017de4cf:
  do {
    do {
      do {
        auVar123 = auVar235._0_16_;
        auVar122 = auVar229._0_16_;
        if ((int)uVar22 == 0) {
          if (bVar26) goto LAB_017df3d7;
          uVar115 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar18._4_4_ = uVar115;
          auVar18._0_4_ = uVar115;
          auVar18._8_4_ = uVar115;
          auVar18._12_4_ = uVar115;
          uVar13 = vcmpps_avx512vl(auVar38,auVar18,2);
          uVar27 = (ulong)((uint)uVar27 & (uint)uVar27 + 0xf & (uint)uVar13);
          goto LAB_017dd8cc;
        }
        uVar21 = (int)uVar22 - 1;
        uVar6 = mask_stack[uVar21];
        auVar75._8_8_ = 0;
        auVar75._0_4_ = cv_stack[uVar21].lower;
        auVar75._4_4_ = cv_stack[uVar21].upper;
        uVar32 = 0;
        for (uVar25 = (ulong)uVar6; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          uVar32 = uVar32 + 1;
        }
        uVar24 = uVar6 - 1 & uVar6;
        bVar30 = uVar24 == 0;
        mask_stack[uVar21] = uVar24;
        if (bVar30) {
          uVar22 = (ulong)uVar21;
        }
        auVar116._8_8_ = 0;
        auVar116._0_8_ = uVar32;
        auVar58 = vpunpcklqdq_avx(auVar116,ZEXT416((int)uVar32 + 1));
        auVar58 = vcvtqq2ps_avx512vl(auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar232._0_16_);
        fVar202 = cu_stack[uVar21].upper;
        auVar15._4_4_ = fVar202;
        auVar15._0_4_ = fVar202;
        auVar15._8_4_ = fVar202;
        auVar15._12_4_ = fVar202;
        auVar66 = vmulps_avx512vl(auVar58,auVar15);
        auVar58 = vsubps_avx512vl(auVar123,auVar58);
        fVar202 = cu_stack[uVar21].lower;
        auVar16._4_4_ = fVar202;
        auVar16._0_4_ = fVar202;
        auVar16._8_4_ = fVar202;
        auVar16._12_4_ = fVar202;
        auVar58 = vfmadd231ps_avx512vl(auVar66,auVar58,auVar16);
        auVar66 = vmovshdup_avx(auVar58);
        fVar202 = auVar66._0_4_ - auVar58._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        if (uVar6 == 0 || bVar30) goto LAB_017ddfc7;
        auVar66 = vshufps_avx(auVar75,auVar75,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        auVar67 = vsubps_avx512vl(auVar123,auVar66);
        fVar186 = auVar66._0_4_;
        auVar144._0_4_ = fVar186 * fVar137;
        fVar197 = auVar66._4_4_;
        auVar144._4_4_ = fVar197 * fVar141;
        fVar199 = auVar66._8_4_;
        auVar144._8_4_ = fVar199 * fVar137;
        fVar201 = auVar66._12_4_;
        auVar144._12_4_ = fVar201 * fVar141;
        auVar149._0_4_ = fVar186 * fVar177;
        auVar149._4_4_ = fVar197 * fVar153;
        auVar149._8_4_ = fVar199 * fVar177;
        auVar149._12_4_ = fVar201 * fVar153;
        auVar154._0_4_ = fVar186 * fVar158;
        auVar154._4_4_ = fVar197 * fVar159;
        auVar154._8_4_ = fVar199 * fVar158;
        auVar154._12_4_ = fVar201 * fVar159;
        auVar133._0_4_ = fVar186 * fVar198;
        auVar133._4_4_ = fVar197 * fVar200;
        auVar133._8_4_ = fVar199 * fVar198;
        auVar133._12_4_ = fVar201 * fVar200;
        auVar66 = vfmadd231ps_fma(auVar144,auVar67,auVar44);
        auVar64 = vfmadd231ps_fma(auVar149,auVar67,auVar46);
        auVar65 = vfmadd231ps_fma(auVar154,auVar67,auVar160);
        auVar67 = vfmadd231ps_fma(auVar133,auVar67,auVar168);
        auVar90._16_16_ = auVar66;
        auVar90._0_16_ = auVar66;
        auVar91._16_16_ = auVar64;
        auVar91._0_16_ = auVar64;
        auVar93._16_16_ = auVar65;
        auVar93._0_16_ = auVar65;
        auVar97 = vpermps_avx512vl(auVar233._0_32_,ZEXT1632(auVar58));
        auVar99 = vsubps_avx(auVar91,auVar90);
        auVar64 = vfmadd213ps_fma(auVar99,auVar97,auVar90);
        auVar99 = vsubps_avx(auVar93,auVar91);
        auVar77 = vfmadd213ps_fma(auVar99,auVar97,auVar91);
        auVar66 = vsubps_avx(auVar67,auVar65);
        auVar92._16_16_ = auVar66;
        auVar92._0_16_ = auVar66;
        auVar66 = vfmadd213ps_fma(auVar92,auVar97,auVar93);
        auVar99 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar64));
        auVar64 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar64));
        auVar99 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar77));
        auVar66 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar77));
        auVar99 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar64));
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar99,auVar97);
        auVar99 = vmulps_avx512vl(auVar99,auVar231._0_32_);
        auVar89._16_16_ = auVar99._16_16_;
        auVar66 = vmulss_avx512f(ZEXT416((uint)fVar202),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar186 = auVar66._0_4_;
        auVar155._0_8_ =
             CONCAT44(auVar142._4_4_ + fVar186 * auVar99._4_4_,
                      auVar142._0_4_ + fVar186 * auVar99._0_4_);
        auVar155._8_4_ = auVar142._8_4_ + fVar186 * auVar99._8_4_;
        auVar155._12_4_ = auVar142._12_4_ + fVar186 * auVar99._12_4_;
        auVar145._0_4_ = fVar186 * auVar99._16_4_;
        auVar145._4_4_ = fVar186 * auVar99._20_4_;
        auVar145._8_4_ = fVar186 * auVar99._24_4_;
        auVar145._12_4_ = fVar186 * auVar99._28_4_;
        auVar74 = vsubps_avx((undefined1  [16])0x0,auVar145);
        auVar77 = vshufpd_avx(auVar142,auVar142,3);
        auVar80 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar66 = vsubps_avx(auVar77,auVar142);
        auVar64 = vsubps_avx(auVar80,(undefined1  [16])0x0);
        auVar169._0_4_ = auVar66._0_4_ + auVar64._0_4_;
        auVar169._4_4_ = auVar66._4_4_ + auVar64._4_4_;
        auVar169._8_4_ = auVar66._8_4_ + auVar64._8_4_;
        auVar169._12_4_ = auVar66._12_4_ + auVar64._12_4_;
        auVar66 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar64 = vshufps_avx(auVar155,auVar155,0xb1);
        auVar65 = vshufps_avx(auVar74,auVar74,0xb1);
        auVar67 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar222._4_4_ = auVar169._0_4_;
        auVar222._0_4_ = auVar169._0_4_;
        auVar222._8_4_ = auVar169._0_4_;
        auVar222._12_4_ = auVar169._0_4_;
        auVar70 = vshufps_avx(auVar169,auVar169,0x55);
        fVar186 = auVar70._0_4_;
        auVar182._0_4_ = auVar66._0_4_ * fVar186;
        fVar197 = auVar70._4_4_;
        auVar182._4_4_ = auVar66._4_4_ * fVar197;
        fVar199 = auVar70._8_4_;
        auVar182._8_4_ = auVar66._8_4_ * fVar199;
        fVar201 = auVar70._12_4_;
        auVar182._12_4_ = auVar66._12_4_ * fVar201;
        auVar188._0_4_ = auVar64._0_4_ * fVar186;
        auVar188._4_4_ = auVar64._4_4_ * fVar197;
        auVar188._8_4_ = auVar64._8_4_ * fVar199;
        auVar188._12_4_ = auVar64._12_4_ * fVar201;
        auVar206._0_4_ = auVar65._0_4_ * fVar186;
        auVar206._4_4_ = auVar65._4_4_ * fVar197;
        auVar206._8_4_ = auVar65._8_4_ * fVar199;
        auVar206._12_4_ = auVar65._12_4_ * fVar201;
        auVar170._0_4_ = auVar67._0_4_ * fVar186;
        auVar170._4_4_ = auVar67._4_4_ * fVar197;
        auVar170._8_4_ = auVar67._8_4_ * fVar199;
        auVar170._12_4_ = auVar67._12_4_ * fVar201;
        auVar66 = vfmadd231ps_fma(auVar182,auVar222,auVar142);
        auVar64 = vfmadd231ps_fma(auVar188,auVar222,auVar155);
        auVar72 = vfmadd231ps_fma(auVar206,auVar222,auVar74);
        auVar73 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar222);
        auVar70 = vshufpd_avx(auVar66,auVar66,1);
        auVar71 = vshufpd_avx(auVar64,auVar64,1);
        auVar68 = vshufpd_avx512vl(auVar72,auVar72,1);
        auVar69 = vshufpd_avx512vl(auVar73,auVar73,1);
        auVar65 = vminss_avx(auVar66,auVar64);
        auVar66 = vmaxss_avx(auVar64,auVar66);
        auVar67 = vminss_avx(auVar72,auVar73);
        auVar64 = vmaxss_avx(auVar73,auVar72);
        auVar65 = vminss_avx(auVar65,auVar67);
        auVar66 = vmaxss_avx(auVar64,auVar66);
        auVar67 = vminss_avx(auVar70,auVar71);
        auVar64 = vmaxss_avx(auVar71,auVar70);
        auVar70 = vminss_avx512f(auVar68,auVar69);
        auVar71 = vmaxss_avx512f(auVar69,auVar68);
        auVar64 = vmaxss_avx(auVar71,auVar64);
        auVar67 = vminss_avx512f(auVar67,auVar70);
        vucomiss_avx512f(auVar65);
        fVar197 = auVar64._0_4_;
        fVar186 = auVar66._0_4_;
        if (4 < (uint)uVar22) {
          bVar31 = fVar197 == -0.0001;
          bVar28 = NAN(fVar197);
          if (fVar197 <= -0.0001) goto LAB_017de6f2;
          break;
        }
LAB_017de6f2:
        auVar70 = vucomiss_avx512f(auVar67);
        bVar31 = fVar197 <= -0.0001;
        bVar29 = -0.0001 < fVar186;
        bVar28 = bVar31;
        if (!bVar31) break;
        uVar13 = vcmpps_avx512vl(auVar65,auVar70,5);
        uVar14 = vcmpps_avx512vl(auVar67,auVar70,5);
        bVar20 = (byte)uVar13 & (byte)uVar14;
        bVar19 = (bVar20 & 1) == 0;
        bVar31 = bVar29 && bVar19;
        bVar28 = bVar29 && (bVar20 & 1) == 0;
      } while (!bVar29 || !bVar19);
      auVar72 = auVar236._0_16_;
      vcmpss_avx512f(auVar65,auVar72,1);
      uVar13 = vcmpss_avx512f(auVar66,auVar72,1);
      bVar29 = (bool)((byte)uVar13 & 1);
      auVar89._0_16_ = auVar237._0_16_;
      auVar103._4_28_ = auVar89._4_28_;
      auVar103._0_4_ = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * auVar237._0_4_);
      vucomiss_avx512f(auVar103._0_16_);
      bVar28 = (bool)(!bVar31 | bVar28);
      bVar29 = bVar28 == false;
      auVar105._16_16_ = auVar89._16_16_;
      auVar105._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar104._4_28_ = auVar105._4_28_;
      auVar104._0_4_ = (uint)bVar28 * auVar236._0_4_ + (uint)!bVar28 * 0x7f800000;
      auVar71 = auVar104._0_16_;
      auVar107._16_16_ = auVar89._16_16_;
      auVar107._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar106._4_28_ = auVar107._4_28_;
      auVar106._0_4_ = (uint)bVar28 * auVar236._0_4_ + (uint)!bVar28 * -0x800000;
      auVar70 = auVar106._0_16_;
      uVar13 = vcmpss_avx512f(auVar67,auVar72,1);
      bVar31 = (bool)((byte)uVar13 & 1);
      auVar109._16_16_ = auVar89._16_16_;
      auVar109._0_16_ = auVar237._0_16_;
      auVar108._4_28_ = auVar109._4_28_;
      auVar108._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * auVar237._0_4_);
      vucomiss_avx512f(auVar108._0_16_);
      if ((bVar28) || (bVar29)) {
        auVar67 = vucomiss_avx512f(auVar65);
        if ((bVar28) || (bVar29)) {
          auVar73 = vxorps_avx512vl(auVar65,auVar230._0_16_);
          auVar65 = vsubss_avx512f(auVar67,auVar65);
          auVar65 = vdivss_avx512f(auVar73,auVar65);
          auVar67 = vsubss_avx512f(ZEXT416(0x3f800000),auVar65);
          auVar67 = vfmadd213ss_avx512f(auVar67,auVar72,auVar65);
          auVar65 = auVar67;
        }
        else {
          auVar65 = vxorps_avx512vl(auVar67,auVar67);
          vucomiss_avx512f(auVar65);
          auVar67 = ZEXT416(0x3f800000);
          if ((bVar28) || (bVar29)) {
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            auVar65 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar71 = vminss_avx512f(auVar71,auVar65);
        auVar70 = vmaxss_avx(auVar67,auVar70);
      }
      auVar237 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar64,auVar72,1);
      bVar31 = (bool)((byte)uVar13 & 1);
      auVar64 = auVar237._0_16_;
      fVar199 = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * 0x3f800000);
      if ((auVar103._0_4_ != fVar199) || (NAN(auVar103._0_4_) || NAN(fVar199))) {
        if ((fVar197 != fVar186) || (NAN(fVar197) || NAN(fVar186))) {
          auVar66 = vxorps_avx512vl(auVar66,auVar230._0_16_);
          auVar171._0_4_ = auVar66._0_4_ / (fVar197 - fVar186);
          auVar171._4_12_ = auVar66._4_12_;
          auVar66 = vsubss_avx512f(auVar64,auVar171);
          auVar66 = vfmadd213ss_avx512f(auVar66,auVar72,auVar171);
          auVar65 = auVar66;
        }
        else if ((fVar186 != 0.0) ||
                (auVar66 = auVar64, auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar186))) {
          auVar66 = SUB6416(ZEXT464(0xff800000),0);
          auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar71 = vminss_avx(auVar71,auVar65);
        auVar70 = vmaxss_avx(auVar66,auVar70);
      }
      bVar31 = auVar108._0_4_ != fVar199;
      auVar66 = vminss_avx512f(auVar71,auVar64);
      auVar111._16_16_ = auVar89._16_16_;
      auVar111._0_16_ = auVar71;
      auVar110._4_28_ = auVar111._4_28_;
      auVar110._0_4_ = (uint)bVar31 * auVar66._0_4_ + (uint)!bVar31 * auVar71._0_4_;
      auVar66 = vmaxss_avx512f(auVar64,auVar70);
      auVar113._16_16_ = auVar89._16_16_;
      auVar113._0_16_ = auVar70;
      auVar112._4_28_ = auVar113._4_28_;
      auVar112._0_4_ = (uint)bVar31 * auVar66._0_4_ + (uint)!bVar31 * auVar70._0_4_;
      auVar66 = vmaxss_avx512f(auVar72,auVar110._0_16_);
      auVar65 = vminss_avx512f(auVar112._0_16_,auVar64);
    } while (auVar65._0_4_ < auVar66._0_4_);
    auVar72 = vmaxss_avx512f(auVar72,ZEXT416((uint)(auVar66._0_4_ + -0.1)));
    auVar73 = vminss_avx512f(ZEXT416((uint)(auVar65._0_4_ + 0.1)),auVar64);
    auVar134._0_8_ = auVar142._0_8_;
    auVar134._8_8_ = auVar134._0_8_;
    auVar189._8_8_ = auVar155._0_8_;
    auVar189._0_8_ = auVar155._0_8_;
    auVar207._8_8_ = auVar74._0_8_;
    auVar207._0_8_ = auVar74._0_8_;
    auVar66 = vshufpd_avx(auVar155,auVar155,3);
    auVar65 = vshufpd_avx(auVar74,auVar74,3);
    auVar67 = vshufps_avx(auVar72,auVar73,0);
    auVar71 = vsubps_avx512vl(auVar123,auVar67);
    fVar186 = auVar67._0_4_;
    auVar150._0_4_ = fVar186 * auVar77._0_4_;
    fVar197 = auVar67._4_4_;
    auVar150._4_4_ = fVar197 * auVar77._4_4_;
    fVar199 = auVar67._8_4_;
    auVar150._8_4_ = fVar199 * auVar77._8_4_;
    fVar201 = auVar67._12_4_;
    auVar150._12_4_ = fVar201 * auVar77._12_4_;
    auVar156._0_4_ = fVar186 * auVar66._0_4_;
    auVar156._4_4_ = fVar197 * auVar66._4_4_;
    auVar156._8_4_ = fVar199 * auVar66._8_4_;
    auVar156._12_4_ = fVar201 * auVar66._12_4_;
    auVar224._0_4_ = auVar65._0_4_ * fVar186;
    auVar224._4_4_ = auVar65._4_4_ * fVar197;
    auVar224._8_4_ = auVar65._8_4_ * fVar199;
    auVar224._12_4_ = auVar65._12_4_ * fVar201;
    auVar146._0_4_ = fVar186 * auVar80._0_4_;
    auVar146._4_4_ = fVar197 * auVar80._4_4_;
    auVar146._8_4_ = fVar199 * auVar80._8_4_;
    auVar146._12_4_ = fVar201 * auVar80._12_4_;
    auVar77 = vfmadd231ps_fma(auVar150,auVar71,auVar134);
    auVar80 = vfmadd231ps_fma(auVar156,auVar71,auVar189);
    auVar70 = vfmadd231ps_fma(auVar224,auVar71,auVar207);
    auVar71 = vfmadd231ps_fma(auVar146,auVar71,ZEXT816(0));
    auVar65 = vsubss_avx512f(auVar64,auVar72);
    auVar66 = vmovshdup_avx(auVar75);
    auVar142 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar72._0_4_)),auVar75,auVar65);
    auVar65 = vsubss_avx512f(auVar64,auVar73);
    auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar73._0_4_)),auVar75,auVar65);
    auVar74 = vdivss_avx512f(auVar64,ZEXT416((uint)fVar202));
    auVar75 = vsubps_avx(auVar80,auVar77);
    auVar65 = vmulps_avx512vl(auVar75,auVar122);
    auVar75 = vsubps_avx(auVar70,auVar80);
    auVar67 = vmulps_avx512vl(auVar75,auVar122);
    auVar75 = vsubps_avx(auVar71,auVar70);
    auVar75 = vmulps_avx512vl(auVar75,auVar122);
    auVar66 = vminps_avx(auVar67,auVar75);
    auVar75 = vmaxps_avx(auVar67,auVar75);
    auVar66 = vminps_avx(auVar65,auVar66);
    auVar75 = vmaxps_avx(auVar65,auVar75);
    auVar65 = vshufpd_avx(auVar66,auVar66,3);
    auVar67 = vshufpd_avx(auVar75,auVar75,3);
    auVar66 = vminps_avx(auVar66,auVar65);
    auVar75 = vmaxps_avx(auVar75,auVar67);
    fVar202 = auVar74._0_4_;
    auVar172._0_4_ = auVar66._0_4_ * fVar202;
    auVar172._4_4_ = auVar66._4_4_ * fVar202;
    auVar172._8_4_ = auVar66._8_4_ * fVar202;
    auVar172._12_4_ = auVar66._12_4_ * fVar202;
    auVar161._0_4_ = fVar202 * auVar75._0_4_;
    auVar161._4_4_ = fVar202 * auVar75._4_4_;
    auVar161._8_4_ = fVar202 * auVar75._8_4_;
    auVar161._12_4_ = fVar202 * auVar75._12_4_;
    auVar74 = vdivss_avx512f(auVar64,ZEXT416((uint)(auVar68._0_4_ - auVar142._0_4_)));
    auVar75 = vshufpd_avx(auVar77,auVar77,3);
    auVar66 = vshufpd_avx(auVar80,auVar80,3);
    auVar65 = vshufpd_avx(auVar70,auVar70,3);
    auVar67 = vshufpd_avx(auVar71,auVar71,3);
    auVar75 = vsubps_avx(auVar75,auVar77);
    auVar77 = vsubps_avx(auVar66,auVar80);
    auVar80 = vsubps_avx(auVar65,auVar70);
    auVar67 = vsubps_avx(auVar67,auVar71);
    auVar66 = vminps_avx(auVar75,auVar77);
    auVar75 = vmaxps_avx(auVar75,auVar77);
    auVar65 = vminps_avx(auVar80,auVar67);
    auVar65 = vminps_avx(auVar66,auVar65);
    auVar66 = vmaxps_avx(auVar80,auVar67);
    auVar75 = vmaxps_avx(auVar75,auVar66);
    fVar202 = auVar74._0_4_;
    auVar208._0_4_ = fVar202 * auVar65._0_4_;
    auVar208._4_4_ = fVar202 * auVar65._4_4_;
    auVar208._8_4_ = fVar202 * auVar65._8_4_;
    auVar208._12_4_ = fVar202 * auVar65._12_4_;
    auVar190._0_4_ = fVar202 * auVar75._0_4_;
    auVar190._4_4_ = fVar202 * auVar75._4_4_;
    auVar190._8_4_ = fVar202 * auVar75._8_4_;
    auVar190._12_4_ = fVar202 * auVar75._12_4_;
    auVar67 = vinsertps_avx(auVar58,auVar142,0x10);
    auVar69 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9f90,auVar68);
    auVar120._0_4_ = auVar67._0_4_ + auVar69._0_4_;
    auVar120._4_4_ = auVar67._4_4_ + auVar69._4_4_;
    auVar120._8_4_ = auVar67._8_4_ + auVar69._8_4_;
    auVar120._12_4_ = auVar67._12_4_ + auVar69._12_4_;
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
    auVar74 = vmulps_avx512vl(auVar120,auVar17);
    auVar66 = vshufps_avx(auVar74,auVar74,0x54);
    uVar115 = auVar74._0_4_;
    auVar125._4_4_ = uVar115;
    auVar125._0_4_ = uVar115;
    auVar125._8_4_ = uVar115;
    auVar125._12_4_ = uVar115;
    auVar65 = vfmadd213ps_fma(auVar37,auVar125,auVar11);
    auVar77 = vfmadd213ps_fma(auVar47,auVar125,auVar34);
    auVar80 = vfmadd213ps_fma(auVar59,auVar125,auVar42);
    auVar75 = vsubps_avx(auVar77,auVar65);
    auVar65 = vfmadd213ps_fma(auVar75,auVar125,auVar65);
    auVar75 = vsubps_avx(auVar80,auVar77);
    auVar75 = vfmadd213ps_fma(auVar75,auVar125,auVar77);
    auVar75 = vsubps_avx(auVar75,auVar65);
    auVar65 = vfmadd231ps_fma(auVar65,auVar75,auVar125);
    auVar70 = vmulps_avx512vl(auVar75,auVar122);
    auVar217._8_8_ = auVar65._0_8_;
    auVar217._0_8_ = auVar65._0_8_;
    auVar75 = vshufpd_avx(auVar65,auVar65,3);
    auVar65 = vshufps_avx(auVar74,auVar74,0x55);
    auVar77 = vsubps_avx(auVar75,auVar217);
    auVar80 = vfmadd231ps_fma(auVar217,auVar65,auVar77);
    auVar225._8_8_ = auVar70._0_8_;
    auVar225._0_8_ = auVar70._0_8_;
    auVar75 = vshufpd_avx(auVar70,auVar70,3);
    auVar75 = vsubps_avx512vl(auVar75,auVar225);
    auVar75 = vfmadd213ps_avx512vl(auVar75,auVar65,auVar225);
    auVar126._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
    auVar126._8_4_ = auVar77._8_4_ ^ 0x80000000;
    auVar126._12_4_ = auVar77._12_4_ ^ 0x80000000;
    auVar65 = vmovshdup_avx512vl(auVar75);
    auVar226._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
    auVar226._8_4_ = auVar65._8_4_ ^ 0x80000000;
    auVar226._12_4_ = auVar65._12_4_ ^ 0x80000000;
    auVar70 = vmovshdup_avx512vl(auVar77);
    auVar71 = vpermt2ps_avx512vl(auVar226,ZEXT416(5),auVar77);
    auVar76 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar236 = ZEXT1664(auVar76);
    auVar65 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar65._0_4_ * auVar77._0_4_)),auVar75,auVar70);
    auVar77 = vpermt2ps_avx512vl(auVar75,SUB6416(ZEXT464(4),0),auVar126);
    auVar147._0_4_ = auVar65._0_4_;
    auVar147._4_4_ = auVar147._0_4_;
    auVar147._8_4_ = auVar147._0_4_;
    auVar147._12_4_ = auVar147._0_4_;
    auVar75 = vdivps_avx(auVar71,auVar147);
    auVar78 = vdivps_avx512vl(auVar77,auVar147);
    fVar202 = auVar80._0_4_;
    auVar65 = vshufps_avx(auVar80,auVar80,0x55);
    auVar218._0_4_ = fVar202 * auVar75._0_4_ + auVar65._0_4_ * auVar78._0_4_;
    auVar218._4_4_ = fVar202 * auVar75._4_4_ + auVar65._4_4_ * auVar78._4_4_;
    auVar218._8_4_ = fVar202 * auVar75._8_4_ + auVar65._8_4_ * auVar78._8_4_;
    auVar218._12_4_ = fVar202 * auVar75._12_4_ + auVar65._12_4_ * auVar78._12_4_;
    auVar72 = vsubps_avx(auVar66,auVar218);
    auVar65 = vmovshdup_avx(auVar75);
    auVar66 = vinsertps_avx(auVar172,auVar208,0x1c);
    auVar227._0_4_ = auVar65._0_4_ * auVar66._0_4_;
    auVar227._4_4_ = auVar65._4_4_ * auVar66._4_4_;
    auVar227._8_4_ = auVar65._8_4_ * auVar66._8_4_;
    auVar227._12_4_ = auVar65._12_4_ * auVar66._12_4_;
    auVar73 = vinsertps_avx512f(auVar161,auVar190,0x1c);
    auVar65 = vmulps_avx512vl(auVar65,auVar73);
    auVar71 = vminps_avx512vl(auVar227,auVar65);
    auVar80 = vmaxps_avx(auVar65,auVar227);
    auVar70 = vmovshdup_avx(auVar78);
    auVar65 = vinsertps_avx(auVar208,auVar172,0x4c);
    auVar209._0_4_ = auVar70._0_4_ * auVar65._0_4_;
    auVar209._4_4_ = auVar70._4_4_ * auVar65._4_4_;
    auVar209._8_4_ = auVar70._8_4_ * auVar65._8_4_;
    auVar209._12_4_ = auVar70._12_4_ * auVar65._12_4_;
    auVar77 = vinsertps_avx(auVar190,auVar161,0x4c);
    auVar191._0_4_ = auVar70._0_4_ * auVar77._0_4_;
    auVar191._4_4_ = auVar70._4_4_ * auVar77._4_4_;
    auVar191._8_4_ = auVar70._8_4_ * auVar77._8_4_;
    auVar191._12_4_ = auVar70._12_4_ * auVar77._12_4_;
    auVar70 = vminps_avx(auVar209,auVar191);
    auVar71 = vaddps_avx512vl(auVar71,auVar70);
    auVar70 = vmaxps_avx(auVar191,auVar209);
    auVar192._0_4_ = auVar80._0_4_ + auVar70._0_4_;
    auVar192._4_4_ = auVar80._4_4_ + auVar70._4_4_;
    auVar192._8_4_ = auVar80._8_4_ + auVar70._8_4_;
    auVar192._12_4_ = auVar80._12_4_ + auVar70._12_4_;
    auVar210._8_8_ = 0x3f80000000000000;
    auVar210._0_8_ = 0x3f80000000000000;
    auVar80 = vsubps_avx(auVar210,auVar192);
    auVar70 = vsubps_avx(auVar210,auVar71);
    auVar71 = vsubps_avx(auVar67,auVar74);
    auVar74 = vsubps_avx(auVar69,auVar74);
    fVar201 = auVar71._0_4_;
    auVar228._0_4_ = fVar201 * auVar80._0_4_;
    fVar185 = auVar71._4_4_;
    auVar228._4_4_ = fVar185 * auVar80._4_4_;
    fVar196 = auVar71._8_4_;
    auVar228._8_4_ = fVar196 * auVar80._8_4_;
    fVar203 = auVar71._12_4_;
    auVar228._12_4_ = fVar203 * auVar80._12_4_;
    auVar79 = vbroadcastss_avx512vl(auVar75);
    auVar66 = vmulps_avx512vl(auVar79,auVar66);
    auVar73 = vmulps_avx512vl(auVar79,auVar73);
    auVar79 = vminps_avx512vl(auVar66,auVar73);
    auVar73 = vmaxps_avx512vl(auVar73,auVar66);
    auVar66 = vbroadcastss_avx512vl(auVar78);
    auVar65 = vmulps_avx512vl(auVar66,auVar65);
    auVar66 = vmulps_avx512vl(auVar66,auVar77);
    auVar77 = vminps_avx512vl(auVar65,auVar66);
    auVar77 = vaddps_avx512vl(auVar79,auVar77);
    auVar71 = vmulps_avx512vl(auVar71,auVar70);
    fVar202 = auVar74._0_4_;
    auVar193._0_4_ = fVar202 * auVar80._0_4_;
    fVar186 = auVar74._4_4_;
    auVar193._4_4_ = fVar186 * auVar80._4_4_;
    fVar197 = auVar74._8_4_;
    auVar193._8_4_ = fVar197 * auVar80._8_4_;
    fVar199 = auVar74._12_4_;
    auVar193._12_4_ = fVar199 * auVar80._12_4_;
    auVar211._0_4_ = fVar202 * auVar70._0_4_;
    auVar211._4_4_ = fVar186 * auVar70._4_4_;
    auVar211._8_4_ = fVar197 * auVar70._8_4_;
    auVar211._12_4_ = fVar199 * auVar70._12_4_;
    auVar66 = vmaxps_avx(auVar66,auVar65);
    auVar162._0_4_ = auVar73._0_4_ + auVar66._0_4_;
    auVar162._4_4_ = auVar73._4_4_ + auVar66._4_4_;
    auVar162._8_4_ = auVar73._8_4_ + auVar66._8_4_;
    auVar162._12_4_ = auVar73._12_4_ + auVar66._12_4_;
    auVar173._8_8_ = 0x3f800000;
    auVar173._0_8_ = 0x3f800000;
    auVar66 = vsubps_avx(auVar173,auVar162);
    auVar65 = vsubps_avx512vl(auVar173,auVar77);
    auVar223._0_4_ = fVar201 * auVar66._0_4_;
    auVar223._4_4_ = fVar185 * auVar66._4_4_;
    auVar223._8_4_ = fVar196 * auVar66._8_4_;
    auVar223._12_4_ = fVar203 * auVar66._12_4_;
    auVar219._0_4_ = fVar201 * auVar65._0_4_;
    auVar219._4_4_ = fVar185 * auVar65._4_4_;
    auVar219._8_4_ = fVar196 * auVar65._8_4_;
    auVar219._12_4_ = fVar203 * auVar65._12_4_;
    auVar163._0_4_ = fVar202 * auVar66._0_4_;
    auVar163._4_4_ = fVar186 * auVar66._4_4_;
    auVar163._8_4_ = fVar197 * auVar66._8_4_;
    auVar163._12_4_ = fVar199 * auVar66._12_4_;
    auVar174._0_4_ = fVar202 * auVar65._0_4_;
    auVar174._4_4_ = fVar186 * auVar65._4_4_;
    auVar174._8_4_ = fVar197 * auVar65._8_4_;
    auVar174._12_4_ = fVar199 * auVar65._12_4_;
    auVar66 = vminps_avx(auVar223,auVar219);
    auVar65 = vminps_avx512vl(auVar163,auVar174);
    auVar77 = vminps_avx512vl(auVar66,auVar65);
    auVar66 = vmaxps_avx(auVar219,auVar223);
    auVar65 = vmaxps_avx(auVar174,auVar163);
    auVar65 = vmaxps_avx(auVar65,auVar66);
    auVar80 = vminps_avx512vl(auVar228,auVar71);
    auVar66 = vminps_avx(auVar193,auVar211);
    auVar66 = vminps_avx(auVar80,auVar66);
    auVar66 = vhaddps_avx(auVar77,auVar66);
    auVar80 = vmaxps_avx512vl(auVar71,auVar228);
    auVar77 = vmaxps_avx(auVar211,auVar193);
    auVar77 = vmaxps_avx(auVar77,auVar80);
    auVar65 = vhaddps_avx(auVar65,auVar77);
    auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
    auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
    auVar164._0_4_ = auVar66._0_4_ + auVar72._0_4_;
    auVar164._4_4_ = auVar66._4_4_ + auVar72._4_4_;
    auVar164._8_4_ = auVar66._8_4_ + auVar72._8_4_;
    auVar164._12_4_ = auVar66._12_4_ + auVar72._12_4_;
    auVar175._0_4_ = auVar65._0_4_ + auVar72._0_4_;
    auVar175._4_4_ = auVar65._4_4_ + auVar72._4_4_;
    auVar175._8_4_ = auVar65._8_4_ + auVar72._8_4_;
    auVar175._12_4_ = auVar65._12_4_ + auVar72._12_4_;
    auVar66 = vmaxps_avx(auVar67,auVar164);
    auVar65 = vminps_avx(auVar175,auVar69);
    uVar32 = vcmpps_avx512vl(auVar65,auVar66,1);
  } while ((uVar32 & 3) != 0);
  uVar32 = vcmpps_avx512vl(auVar175,auVar69,1);
  uVar13 = vcmpps_avx512vl(auVar58,auVar164,1);
  if (((ushort)uVar13 & (ushort)uVar32 & 1) == 0) {
    bVar20 = 0;
  }
  else {
    auVar66 = vmovshdup_avx(auVar164);
    bVar20 = auVar142._0_4_ < auVar66._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar43._0_4_;
  p03.field_0.i[1] = auVar43._4_4_;
  p03.field_0.i[2] = auVar43._8_4_;
  p03.field_0.i[3] = auVar43._12_4_;
  if (((3 < (uint)uVar22 || uVar6 != 0 && !bVar30) | bVar20) != 1) goto LAB_017df360;
  lVar23 = 0xc9;
  do {
    lVar23 = lVar23 + -1;
    if (lVar23 == 0) goto LAB_017de4cf;
    auVar58 = vsubss_avx512f(auVar64,auVar72);
    fVar197 = auVar58._0_4_;
    fVar202 = fVar197 * fVar197 * fVar197;
    fVar199 = auVar72._0_4_;
    fVar186 = fVar199 * 3.0 * fVar197 * fVar197;
    fVar197 = fVar197 * fVar199 * fVar199 * 3.0;
    auVar139._4_4_ = fVar202;
    auVar139._0_4_ = fVar202;
    auVar139._8_4_ = fVar202;
    auVar139._12_4_ = fVar202;
    auVar135._4_4_ = fVar186;
    auVar135._0_4_ = fVar186;
    auVar135._8_4_ = fVar186;
    auVar135._12_4_ = fVar186;
    auVar117._4_4_ = fVar197;
    auVar117._0_4_ = fVar197;
    auVar117._8_4_ = fVar197;
    auVar117._12_4_ = fVar197;
    fVar199 = fVar199 * fVar199 * fVar199;
    auVar151._0_4_ = p03.field_0.v[0] * fVar199;
    auVar151._4_4_ = p03.field_0.v[1] * fVar199;
    auVar151._8_4_ = p03.field_0.v[2] * fVar199;
    auVar151._12_4_ = p03.field_0.v[3] * fVar199;
    auVar58 = vfmadd231ps_fma(auVar151,auVar42,auVar117);
    auVar58 = vfmadd231ps_fma(auVar58,auVar34,auVar135);
    auVar58 = vfmadd231ps_fma(auVar58,auVar11,auVar139);
    auVar118._8_8_ = auVar58._0_8_;
    auVar118._0_8_ = auVar58._0_8_;
    auVar58 = vshufpd_avx(auVar58,auVar58,3);
    auVar66 = vshufps_avx(auVar72,auVar72,0x55);
    auVar58 = vsubps_avx(auVar58,auVar118);
    auVar66 = vfmadd213ps_fma(auVar58,auVar66,auVar118);
    fVar202 = auVar66._0_4_;
    auVar58 = vshufps_avx(auVar66,auVar66,0x55);
    auVar119._0_4_ = auVar75._0_4_ * fVar202 + auVar78._0_4_ * auVar58._0_4_;
    auVar119._4_4_ = auVar75._4_4_ * fVar202 + auVar78._4_4_ * auVar58._4_4_;
    auVar119._8_4_ = auVar75._8_4_ * fVar202 + auVar78._8_4_ * auVar58._8_4_;
    auVar119._12_4_ = auVar75._12_4_ * fVar202 + auVar78._12_4_ * auVar58._12_4_;
    auVar72 = vsubps_avx(auVar72,auVar119);
    auVar58 = vandps_avx512vl(auVar66,auVar234._0_16_);
    auVar66 = vprolq_avx512vl(auVar58,0x20);
    auVar58 = vmaxss_avx(auVar66,auVar58);
    bVar30 = fVar114 < auVar58._0_4_;
  } while (fVar114 <= auVar58._0_4_);
  auVar58 = vucomiss_avx512f(auVar76);
  if (bVar30) goto LAB_017de4cf;
  auVar75 = vucomiss_avx512f(auVar58);
  auVar237 = ZEXT1664(auVar75);
  if (bVar30) goto LAB_017de4cf;
  vmovshdup_avx(auVar58);
  auVar75 = vucomiss_avx512f(auVar76);
  if (bVar30) goto LAB_017de4cf;
  auVar66 = vucomiss_avx512f(auVar75);
  auVar237 = ZEXT1664(auVar66);
  if (bVar30) goto LAB_017de4cf;
  auVar64 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar74 = vinsertps_avx(auVar64,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar64 = vdpps_avx(auVar74,auVar12,0x7f);
  auVar65 = vdpps_avx(auVar74,auVar53,0x7f);
  auVar67 = vdpps_avx(auVar74,auVar54,0x7f);
  auVar77 = vdpps_avx(auVar74,auVar41,0x7f);
  auVar80 = vdpps_avx(auVar74,auVar40,0x7f);
  auVar70 = vdpps_avx(auVar74,auVar55,0x7f);
  auVar71 = vdpps_avx(auVar74,auVar56,0x7f);
  auVar74 = vdpps_avx(auVar74,auVar57,0x7f);
  auVar72 = vsubss_avx512f(auVar66,auVar75);
  fVar202 = auVar75._0_4_;
  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar80._0_4_)),auVar72,auVar64);
  auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar202)),auVar72,auVar65);
  auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * fVar202)),auVar72,auVar67);
  auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar74._0_4_)),auVar72,auVar77);
  auVar66 = vsubss_avx512f(auVar66,auVar58);
  auVar157._0_4_ = auVar66._0_4_;
  fVar202 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  local_d8 = auVar58._0_4_;
  fVar186 = local_d8 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
  fVar197 = auVar157._0_4_ * local_d8 * local_d8 * 3.0;
  fVar199 = local_d8 * local_d8 * local_d8;
  auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * auVar67._0_4_)),ZEXT416((uint)fVar197),auVar65)
  ;
  auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar186),auVar64);
  vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar202),auVar75);
  auVar75 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar30) goto LAB_017de4cf;
  fVar201 = *(float *)(ray + k * 4 + 0x80);
  if (fVar201 < auVar75._0_4_) goto LAB_017de4cf;
  local_c8 = vshufps_avx(auVar58,auVar58,0x55);
  auVar64 = vsubps_avx512vl(auVar123,local_c8);
  fVar185 = local_c8._0_4_;
  auVar176._0_4_ = fVar185 * auVar220._0_4_;
  fVar196 = local_c8._4_4_;
  auVar176._4_4_ = fVar196 * auVar220._4_4_;
  fVar203 = local_c8._8_4_;
  auVar176._8_4_ = fVar203 * auVar220._8_4_;
  fVar213 = local_c8._12_4_;
  auVar176._12_4_ = fVar213 * auVar220._12_4_;
  local_288 = auVar51._0_4_;
  fStack_284 = auVar51._4_4_;
  fStack_280 = auVar51._8_4_;
  fStack_27c = auVar51._12_4_;
  auVar183._0_4_ = fVar185 * local_288;
  auVar183._4_4_ = fVar196 * fStack_284;
  auVar183._8_4_ = fVar203 * fStack_280;
  auVar183._12_4_ = fVar213 * fStack_27c;
  local_298 = auVar52._0_4_;
  fStack_294 = auVar52._4_4_;
  fStack_290 = auVar52._8_4_;
  fStack_28c = auVar52._12_4_;
  auVar194._0_4_ = fVar185 * local_298;
  auVar194._4_4_ = fVar196 * fStack_294;
  auVar194._8_4_ = fVar203 * fStack_290;
  auVar194._12_4_ = fVar213 * fStack_28c;
  local_258 = auVar48._0_4_;
  fStack_254 = auVar48._4_4_;
  fStack_250 = auVar48._8_4_;
  fStack_24c = auVar48._12_4_;
  auVar212._0_4_ = fVar185 * local_258;
  auVar212._4_4_ = fVar196 * fStack_254;
  auVar212._8_4_ = fVar203 * fStack_250;
  auVar212._12_4_ = fVar213 * fStack_24c;
  auVar58 = vfmadd231ps_fma(auVar176,auVar64,auVar45);
  auVar123 = vfmadd231ps_fma(auVar183,auVar64,auVar49);
  auVar66 = vfmadd231ps_fma(auVar194,auVar64,auVar50);
  auVar64 = vfmadd231ps_fma(auVar212,auVar64,auVar35);
  auVar58 = vsubps_avx(auVar123,auVar58);
  auVar123 = vsubps_avx(auVar66,auVar123);
  auVar66 = vsubps_avx(auVar64,auVar66);
  auVar195._0_4_ = auVar123._0_4_ * local_d8;
  auVar195._4_4_ = auVar123._4_4_ * local_d8;
  auVar195._8_4_ = auVar123._8_4_ * local_d8;
  auVar195._12_4_ = auVar123._12_4_ * local_d8;
  auVar157._4_4_ = auVar157._0_4_;
  auVar157._8_4_ = auVar157._0_4_;
  auVar157._12_4_ = auVar157._0_4_;
  auVar58 = vfmadd231ps_fma(auVar195,auVar157,auVar58);
  auVar165._0_4_ = auVar66._0_4_ * local_d8;
  auVar165._4_4_ = auVar66._4_4_ * local_d8;
  auVar165._8_4_ = auVar66._8_4_ * local_d8;
  auVar165._12_4_ = auVar66._12_4_ * local_d8;
  auVar123 = vfmadd231ps_fma(auVar165,auVar157,auVar123);
  auVar166._0_4_ = auVar123._0_4_ * local_d8;
  auVar166._4_4_ = auVar123._4_4_ * local_d8;
  auVar166._8_4_ = auVar123._8_4_ * local_d8;
  auVar166._12_4_ = auVar123._12_4_ * local_d8;
  auVar58 = vfmadd231ps_fma(auVar166,auVar157,auVar58);
  auVar58 = vmulps_avx512vl(auVar58,auVar122);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar20 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_017df351;
    local_2f8 = auVar62._0_4_;
    fStack_2f4 = auVar62._4_4_;
    fStack_2f0 = auVar62._8_4_;
    fStack_2ec = auVar62._12_4_;
    auVar152._0_4_ = fVar199 * local_2f8;
    auVar152._4_4_ = fVar199 * fStack_2f4;
    auVar152._8_4_ = fVar199 * fStack_2f0;
    auVar152._12_4_ = fVar199 * fStack_2ec;
    auVar140._4_4_ = fVar197;
    auVar140._0_4_ = fVar197;
    auVar140._8_4_ = fVar197;
    auVar140._12_4_ = fVar197;
    auVar122 = vfmadd132ps_fma(auVar140,auVar152,auVar61);
    auVar136._4_4_ = fVar186;
    auVar136._0_4_ = fVar186;
    auVar136._8_4_ = fVar186;
    auVar136._12_4_ = fVar186;
    auVar122 = vfmadd132ps_fma(auVar136,auVar122,auVar60);
    auVar127._4_4_ = fVar202;
    auVar127._0_4_ = fVar202;
    auVar127._8_4_ = fVar202;
    auVar127._12_4_ = fVar202;
    auVar66 = vfmadd132ps_fma(auVar127,auVar122,auVar33);
    auVar122 = vshufps_avx(auVar66,auVar66,0xc9);
    auVar123 = vshufps_avx(auVar58,auVar58,0xc9);
    auVar128._0_4_ = auVar66._0_4_ * auVar123._0_4_;
    auVar128._4_4_ = auVar66._4_4_ * auVar123._4_4_;
    auVar128._8_4_ = auVar66._8_4_ * auVar123._8_4_;
    auVar128._12_4_ = auVar66._12_4_ * auVar123._12_4_;
    auVar122 = vfmsub231ps_fma(auVar128,auVar58,auVar122);
    auVar58 = vshufps_avx(auVar122,auVar122,0x55);
    local_f8 = vshufps_avx(auVar122,auVar122,0xaa);
    local_e8 = auVar122._0_4_;
    local_108[0] = (RTCHitN)auVar58[0];
    local_108[1] = (RTCHitN)auVar58[1];
    local_108[2] = (RTCHitN)auVar58[2];
    local_108[3] = (RTCHitN)auVar58[3];
    local_108[4] = (RTCHitN)auVar58[4];
    local_108[5] = (RTCHitN)auVar58[5];
    local_108[6] = (RTCHitN)auVar58[6];
    local_108[7] = (RTCHitN)auVar58[7];
    local_108[8] = (RTCHitN)auVar58[8];
    local_108[9] = (RTCHitN)auVar58[9];
    local_108[10] = (RTCHitN)auVar58[10];
    local_108[0xb] = (RTCHitN)auVar58[0xb];
    local_108[0xc] = (RTCHitN)auVar58[0xc];
    local_108[0xd] = (RTCHitN)auVar58[0xd];
    local_108[0xe] = (RTCHitN)auVar58[0xe];
    local_108[0xf] = (RTCHitN)auVar58[0xf];
    uStack_e4 = local_e8;
    uStack_e0 = local_e8;
    uStack_dc = local_e8;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    local_2b8 = auVar39._0_8_;
    uStack_2b0 = auVar39._8_8_;
    local_b8 = local_2b8;
    uStack_b0 = uStack_2b0;
    local_a8 = auVar63;
    vpcmpeqd_avx2(ZEXT1632(auVar63),ZEXT1632(auVar63));
    uStack_94 = context->user->instID[0];
    local_98 = uStack_94;
    uStack_90 = uStack_94;
    uStack_8c = uStack_94;
    uStack_88 = context->user->instPrimID[0];
    uStack_84 = uStack_88;
    uStack_80 = uStack_88;
    uStack_7c = uStack_88;
    *(float *)(ray + k * 4 + 0x80) = auVar75._0_4_;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar7->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_108;
    args.N = 4;
    local_378 = auVar36;
    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      local_360 = context;
      (*pGVar7->occlusionFilterN)(&args);
      auVar58 = vxorps_avx512vl(auVar76,auVar76);
      auVar236 = ZEXT1664(auVar58);
      auVar237 = ZEXT464(0x3f800000);
      auVar233 = ZEXT3264(_DAT_01fb9fe0);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar232 = ZEXT1664(auVar58);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar231 = ZEXT3264(auVar99);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar230 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar229 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar235 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar234 = ZEXT1664(auVar58);
      context = local_360;
    }
    auVar58 = auVar236._0_16_;
    uVar32 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar32 & 0xf) != 0) {
      p_Var10 = context->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&args);
        auVar58 = vxorps_avx512vl(auVar58,auVar58);
        auVar236 = ZEXT1664(auVar58);
        auVar237 = ZEXT464(0x3f800000);
        auVar233 = ZEXT3264(_DAT_01fb9fe0);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar232 = ZEXT1664(auVar58);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar231 = ZEXT3264(auVar99);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar230 = ZEXT1664(auVar58);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar229 = ZEXT1664(auVar58);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar235 = ZEXT1664(auVar58);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar234 = ZEXT1664(auVar58);
      }
      uVar32 = vptestmd_avx512vl(local_378,local_378);
      uVar32 = uVar32 & 0xf;
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar30 = (bool)((byte)uVar32 & 1);
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      bVar28 = (bool)((byte)(uVar32 >> 2) & 1);
      bVar29 = SUB81(uVar32 >> 3,0);
      *(uint *)(args.ray + 0x80) =
           (uint)bVar30 * auVar58._0_4_ | (uint)!bVar30 * *(int *)(args.ray + 0x80);
      *(uint *)(args.ray + 0x84) =
           (uint)bVar31 * auVar58._4_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x84);
      *(uint *)(args.ray + 0x88) =
           (uint)bVar28 * auVar58._8_4_ | (uint)!bVar28 * *(int *)(args.ray + 0x88);
      *(uint *)(args.ray + 0x8c) =
           (uint)bVar29 * auVar58._12_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x8c);
      bVar20 = 1;
      if ((byte)uVar32 != 0) goto LAB_017df351;
    }
    *(float *)(ray + k * 4 + 0x80) = fVar201;
  }
  bVar20 = 0;
LAB_017df351:
  bVar26 = (bool)(bVar26 | bVar20);
  goto LAB_017de4cf;
LAB_017df360:
  auVar75 = vinsertps_avx(auVar142,auVar68,0x10);
  goto LAB_017ddfc7;
}

Assistant:

static __forceinline vbool<M> intersect(RayK<K>& ray, const size_t k, const Primitive& prim, vfloat<M>& tNear_o)
      {
        const size_t N = prim.N;
#if defined(EMBREE_SYCL_SUPPORT) && defined(__SYCL_DEVICE_ONLY__)
        const Vec3fa offset = *prim.offset(N);
        const float scale  = *prim.scale(N);
#else
        const vfloat4 offset_scale = vfloat4::loadu(prim.offset(N));
        const Vec3fa offset = Vec3fa(offset_scale);
        const Vec3fa scale = Vec3fa(shuffle<3,3,3,3>(offset_scale));
#endif
        const Vec3fa ray_org(ray.org.x[k],ray.org.y[k],ray.org.z[k]);
        const Vec3fa ray_dir(ray.dir.x[k],ray.dir.y[k],ray.dir.z[k]);
        const Vec3fa org1 = (ray_org-offset)*scale;
        const Vec3fa dir1 = ray_dir*scale;
        
        const LinearSpace3vfM space(vfloat<M>::load(prim.bounds_vx_x(N)), vfloat<M>::load(prim.bounds_vx_y(N)), vfloat<M>::load(prim.bounds_vx_z(N)),
                                    vfloat<M>::load(prim.bounds_vy_x(N)), vfloat<M>::load(prim.bounds_vy_y(N)), vfloat<M>::load(prim.bounds_vy_z(N)),
                                    vfloat<M>::load(prim.bounds_vz_x(N)), vfloat<M>::load(prim.bounds_vz_y(N)), vfloat<M>::load(prim.bounds_vz_z(N)));

        const Vec3vfM dir2 = xfmVector(space,Vec3vfM(dir1));
        const Vec3vfM org2 = xfmPoint (space,Vec3vfM(org1));
        const Vec3vfM rcp_dir2 = rcp_safe(dir2);
       
        const vfloat<M> t_lower_x = (vfloat<M>::load(prim.bounds_vx_lower(N))-vfloat<M>(org2.x))*vfloat<M>(rcp_dir2.x);
        const vfloat<M> t_upper_x = (vfloat<M>::load(prim.bounds_vx_upper(N))-vfloat<M>(org2.x))*vfloat<M>(rcp_dir2.x);
        const vfloat<M> t_lower_y = (vfloat<M>::load(prim.bounds_vy_lower(N))-vfloat<M>(org2.y))*vfloat<M>(rcp_dir2.y);
        const vfloat<M> t_upper_y = (vfloat<M>::load(prim.bounds_vy_upper(N))-vfloat<M>(org2.y))*vfloat<M>(rcp_dir2.y);
        const vfloat<M> t_lower_z = (vfloat<M>::load(prim.bounds_vz_lower(N))-vfloat<M>(org2.z))*vfloat<M>(rcp_dir2.z);
        const vfloat<M> t_upper_z = (vfloat<M>::load(prim.bounds_vz_upper(N))-vfloat<M>(org2.z))*vfloat<M>(rcp_dir2.z);

        const vfloat<M> round_up  (1.0f+3.0f*float(ulp));
        const vfloat<M> round_down(1.0f-3.0f*float(ulp));
        const vfloat<M> tNear = round_down*max(mini(t_lower_x,t_upper_x),mini(t_lower_y,t_upper_y),mini(t_lower_z,t_upper_z),vfloat<M>(ray.tnear()[k]));
        const vfloat<M> tFar  = round_up  *min(maxi(t_lower_x,t_upper_x),maxi(t_lower_y,t_upper_y),maxi(t_lower_z,t_upper_z),vfloat<M>(ray.tfar[k]));
        tNear_o = tNear;
        return (vint<M>(step) < vint<M>(prim.N)) & (tNear <= tFar);
      }